

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_dot_pack8.h
# Opt level: O0

void ncnn::convolution_winograd_dot_pack8_avx
               (Mat *bottom_blob_tm,int outch,Mat *kernel_tm,Mat *top_blob_tm,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [24];
  undefined1 auVar58 [24];
  undefined1 auVar59 [24];
  undefined1 auVar60 [24];
  undefined1 auVar61 [24];
  undefined1 auVar62 [24];
  long *in_RCX;
  long *in_RDX;
  int in_ESI;
  void **in_RDI;
  __m256 _val0_4;
  __m256 _w0_4;
  int j_4;
  __m256 _sum0_4;
  int nn_4;
  float *k0_4;
  float *r0_9;
  __m256 _val1_3;
  __m256 _val0_3;
  __m256 _w0_3;
  int j_3;
  __m256 _sum1_3;
  __m256 _sum0_3;
  int nn_3;
  float *k0_3;
  float *r0_8;
  __m256 _val3_2;
  __m256 _val2_2;
  __m256 _val1_2;
  __m256 _val0_2;
  __m256 _w0_2;
  int j_2;
  __m256 _sum3_2;
  __m256 _sum2_2;
  __m256 _sum1_2;
  __m256 _sum0_2;
  int nn_2;
  float *k0_2;
  float *r0_7;
  __m256 _val7_1;
  __m256 _val6_1;
  __m256 _val5_1;
  __m256 _val4_1;
  __m256 _val3_1;
  __m256 _val2_1;
  __m256 _val1_1;
  __m256 _val0_1;
  __m256 _w0_1;
  int j_1;
  __m256 _sum7_1;
  __m256 _sum6_1;
  __m256 _sum5_1;
  __m256 _sum4_1;
  __m256 _sum3_1;
  __m256 _sum2_1;
  __m256 _sum1_1;
  __m256 _sum0_1;
  int nn_1;
  float *k0_1;
  float *r0_6;
  __m256 _valb;
  __m256 _vala;
  __m256 _val9;
  __m256 _val8;
  __m256 _val7;
  __m256 _val6;
  __m256 _val5;
  __m256 _val4;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  __m256 _w0;
  int j;
  __m256 _sumb;
  __m256 _suma;
  __m256 _sum9;
  __m256 _sum8;
  __m256 _sum7;
  __m256 _sum6;
  __m256 _sum5;
  __m256 _sum4;
  __m256 _sum3;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  int nn;
  float *k0;
  float *r0_5;
  int i_1;
  Mat bb2;
  int r_1;
  Mat kernel0_tm;
  float *output0_tm;
  int p;
  __m256 _val;
  int q_4;
  float *r0_4;
  float *tmpptr_4;
  __m256 _tmp1_3;
  __m256 _tmp0_3;
  __m256 _r1_3;
  __m256 _r0_3;
  int q_3;
  float *r0_3;
  float *tmpptr_3;
  __m256 _tmp7_2;
  __m256 _tmp6_2;
  __m256 _tmp5_2;
  __m256 _tmp4_2;
  __m256 _tmp3_2;
  __m256 _tmp2_2;
  __m256 _tmp1_2;
  __m256 _tmp0_2;
  __m256 _r3_2;
  __m256 _r2_2;
  __m256 _r1_2;
  __m256 _r0_2;
  int q_2;
  float *r0_2;
  float *tmpptr_2;
  __m256 _tmpf_1;
  __m256 _tmpe_1;
  __m256 _tmpd_1;
  __m256 _tmpc_1;
  __m256 _tmpb_1;
  __m256 _tmpa_1;
  __m256 _tmp9_1;
  __m256 _tmp8_1;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _r7_1;
  __m256 _r6_1;
  __m256 _r5_1;
  __m256 _r4_1;
  __m256 _r3_1;
  __m256 _r2_1;
  __m256 _r1_1;
  __m256 _r0_1;
  int q_1;
  float *r0_1;
  float *tmpptr_1;
  __m256 _tmpn;
  __m256 _tmpm;
  __m256 _tmpl;
  __m256 _tmpk;
  __m256 _tmpj;
  __m256 _tmpi;
  __m256 _tmph;
  __m256 _tmpg;
  __m256 _tmpf;
  __m256 _tmpe;
  __m256 _tmpd;
  __m256 _tmpc;
  __m256 _tmpb;
  __m256 _tmpa;
  __m256 _tmp9;
  __m256 _tmp8;
  __m256 _tmp7;
  __m256 _tmp6;
  __m256 _tmp5;
  __m256 _tmp4;
  __m256 _tmp3;
  __m256 _tmp2;
  __m256 _tmp1;
  __m256 _tmp0;
  __m256 _rb;
  __m256 _ra;
  __m256 _r9;
  __m256 _r8;
  __m256 _r7;
  __m256 _r6;
  __m256 _r5;
  __m256 _r4;
  __m256 _r3;
  __m256 _r2;
  __m256 _r1;
  __m256 _r0;
  int q;
  float *r0;
  float *tmpptr;
  int i;
  Mat tm2;
  int r;
  Mat bottom_blob_tm2;
  int inch;
  int batch;
  int tiles;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  int in_stack_ffffffffffffa69c;
  size_t in_stack_ffffffffffffa6a0;
  undefined8 in_stack_ffffffffffffa6a8;
  int _c;
  void **ppvVar63;
  int _h;
  undefined8 in_stack_ffffffffffffa6b0;
  int _w;
  Mat *in_stack_ffffffffffffa6b8;
  Allocator *in_stack_ffffffffffffa718;
  int local_5084;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 *local_5050;
  float *local_5048;
  int local_4fc4;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 *local_4f70;
  float *local_4f68;
  int local_4ea4;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 *local_4e10;
  float *local_4e08;
  int local_4cc4;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 *local_4bb0;
  float *local_4ba8;
  int local_49e4;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 *local_4850;
  float *local_4848;
  int local_483c;
  undefined8 local_4838;
  undefined8 local_4830;
  undefined8 local_4828;
  undefined4 local_4820;
  long *local_4818;
  undefined4 local_4810;
  undefined4 local_480c;
  undefined4 local_4808;
  undefined4 local_4804;
  undefined4 local_4800;
  undefined8 local_47f8;
  int local_47ec;
  undefined8 local_47e8;
  undefined8 local_47e0;
  undefined8 local_47d8;
  undefined4 local_47d0;
  long local_47c8;
  undefined4 local_47c0;
  undefined4 local_47bc;
  undefined4 local_47b8;
  undefined4 local_47b4;
  undefined4 local_47b0;
  undefined8 local_47a8;
  undefined8 local_47a0;
  undefined8 local_4798;
  undefined8 local_4790;
  undefined4 local_4788;
  long local_4780;
  undefined4 local_4778;
  undefined4 local_4774;
  undefined4 local_4770;
  undefined4 local_476c;
  undefined4 local_4768;
  undefined8 local_4760;
  undefined1 (*local_4758) [32];
  int local_474c;
  void *local_4748;
  int *local_4740;
  undefined8 local_4738;
  undefined4 local_4730;
  long *local_4728;
  undefined4 local_4720;
  undefined4 local_471c;
  undefined4 local_4718;
  undefined4 local_4714;
  undefined4 local_4710;
  undefined8 local_4708;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  int local_46d4;
  undefined1 (*local_46d0) [32];
  undefined1 (*local_46c8) [32];
  undefined1 local_46c0 [32];
  undefined1 local_46a0 [32];
  undefined1 local_4680 [32];
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  int local_4634;
  undefined1 (*local_4630) [32];
  undefined8 *local_4628;
  undefined1 local_4620 [32];
  undefined1 local_4600 [32];
  undefined1 local_45e0 [32];
  undefined1 local_45c0 [32];
  undefined1 local_45a0 [32];
  undefined1 local_4580 [32];
  undefined1 local_4560 [32];
  undefined1 local_4540 [32];
  undefined1 local_4520 [32];
  undefined1 local_4500 [32];
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  int local_4494;
  undefined1 (*local_4490) [32];
  undefined8 *local_4488;
  undefined1 local_4480 [32];
  undefined1 local_4460 [32];
  undefined1 local_4440 [32];
  undefined1 local_4420 [32];
  undefined1 local_4400 [32];
  undefined1 local_43e0 [32];
  undefined1 local_43c0 [32];
  undefined1 local_43a0 [32];
  undefined1 local_4380 [32];
  undefined1 local_4360 [32];
  undefined1 local_4340 [32];
  undefined1 local_4320 [32];
  undefined1 local_4300 [32];
  undefined1 local_42e0 [32];
  undefined1 local_42c0 [32];
  undefined1 local_42a0 [32];
  undefined1 local_4280 [32];
  undefined1 local_4260 [32];
  undefined1 local_4240 [32];
  undefined1 local_4220 [32];
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  int local_4174;
  undefined1 (*local_4170) [32];
  undefined8 *local_4168;
  undefined1 local_4160 [32];
  undefined1 local_4140 [32];
  undefined1 local_4120 [32];
  undefined1 local_4100 [32];
  undefined1 local_40e0 [32];
  undefined1 local_40c0 [32];
  undefined1 local_40a0 [32];
  undefined1 local_4080 [32];
  undefined1 local_4060 [32];
  undefined1 local_4040 [32];
  undefined1 local_4020 [32];
  undefined1 local_4000 [32];
  undefined1 local_3fe0 [32];
  undefined1 local_3fc0 [32];
  undefined1 local_3fa0 [32];
  undefined1 local_3f80 [32];
  undefined1 local_3f60 [32];
  undefined1 local_3f40 [32];
  undefined1 local_3f20 [32];
  undefined1 local_3f00 [32];
  undefined1 local_3ee0 [32];
  undefined1 local_3ec0 [32];
  undefined1 local_3ea0 [32];
  undefined1 local_3e80 [32];
  undefined1 local_3e60 [32];
  undefined1 local_3e40 [32];
  undefined1 local_3e20 [32];
  undefined1 local_3e00 [32];
  undefined1 local_3de0 [32];
  undefined1 local_3dc0 [32];
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  int local_3cdc;
  undefined1 (*local_3cd8) [32];
  undefined8 *local_3cd0;
  int local_3cc4;
  undefined8 local_3cc0;
  undefined8 local_3cb8;
  undefined8 local_3cb0;
  undefined4 local_3ca8;
  long *local_3ca0;
  undefined4 local_3c98;
  undefined4 local_3c94;
  undefined4 local_3c90;
  undefined4 local_3c8c;
  undefined4 local_3c88;
  undefined8 local_3c80;
  int local_3c78;
  void *local_3c68;
  int *local_3c60;
  long local_3c58;
  undefined4 local_3c50;
  long *local_3c48;
  undefined4 local_3c40;
  int local_3c3c;
  int local_3c38;
  undefined4 local_3c34;
  undefined4 local_3c30;
  long local_3c28;
  int local_3c1c;
  int local_3c18;
  int local_3c14;
  long *local_3c08;
  long *local_3c00;
  int local_3bf4;
  void **local_3bf0;
  void **local_3be8;
  void **local_3be0;
  undefined8 *local_3bd8;
  void **local_3bc8;
  undefined8 *local_3bb8;
  undefined8 *local_3ba8;
  undefined8 *local_3b98;
  void **local_3b88;
  void **local_3b70;
  void **local_3b68;
  int local_3b58;
  undefined4 local_3b54;
  void **local_3b50;
  int local_3b38;
  undefined4 local_3b34;
  void **local_3b30;
  undefined8 *local_3b10;
  undefined8 *local_3af0;
  undefined8 *local_3ad0;
  int local_3ab8;
  undefined4 local_3ab4;
  void **local_3ab0;
  undefined8 *local_3a90;
  undefined1 local_3a85;
  int local_3a84;
  void **local_3a80;
  undefined8 *local_3a78;
  undefined1 local_3a55;
  int local_3a54;
  undefined8 *local_3a48;
  undefined1 local_3a25;
  int local_3a24;
  void **local_3a20;
  undefined8 *local_3a18;
  undefined8 *local_39f8;
  int local_39ec;
  undefined8 *local_39e8;
  int local_39dc;
  undefined8 *local_39d8;
  int local_39cc;
  undefined8 *local_39c8;
  int local_39bc;
  undefined8 *local_39b8;
  int local_39ac;
  undefined8 *local_39a8;
  int local_399c;
  undefined8 *local_3998;
  int local_398c;
  undefined8 *local_3988;
  int local_397c;
  undefined8 *local_3978;
  int local_396c;
  undefined8 *local_3968;
  int local_395c;
  undefined8 *local_3958;
  undefined1 local_394d;
  int local_394c;
  undefined8 *local_3940;
  void **local_3920;
  void **local_3918;
  void **local_3910;
  void **local_3908;
  void **local_3900;
  void *local_38c8;
  void *local_3888;
  void *local_3878;
  int local_386c;
  undefined8 *local_3868;
  int local_385c;
  undefined8 *local_3858;
  int local_384c;
  undefined8 *local_3848;
  int local_383c;
  undefined8 *local_3838;
  int local_382c;
  undefined8 *local_3828;
  undefined8 *local_3820;
  undefined8 *local_3818;
  undefined8 *local_3810;
  undefined8 *local_3808;
  undefined8 *local_3800;
  undefined1 (*local_37f8) [32];
  undefined1 (*local_37f0) [32];
  undefined1 (*local_37e8) [32];
  undefined1 (*local_37e0) [32];
  undefined1 (*local_37d8) [32];
  undefined1 (*local_37d0) [32];
  undefined1 (*local_37c8) [32];
  undefined1 (*local_37c0) [32];
  undefined1 (*local_37b8) [32];
  undefined1 (*local_37b0) [32];
  undefined1 (*local_37a8) [32];
  undefined1 (*local_37a0) [32];
  undefined1 (*local_3798) [32];
  undefined1 (*local_3790) [32];
  undefined1 (*local_3788) [32];
  undefined1 (*local_3780) [32];
  undefined1 (*local_3778) [32];
  undefined1 (*local_3770) [32];
  undefined1 (*local_3768) [32];
  undefined1 (*local_3760) [32];
  undefined1 (*local_3758) [32];
  undefined1 (*local_3750) [32];
  undefined1 (*local_3748) [32];
  undefined1 (*local_3740) [32];
  undefined1 (*local_3738) [32];
  undefined1 (*local_3730) [32];
  undefined1 (*local_3728) [32];
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined1 (*local_3068) [32];
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined1 (*local_3028) [32];
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined1 (*local_2fe8) [32];
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined1 (*local_2fa8) [32];
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined1 (*local_2f68) [32];
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined1 (*local_2f28) [32];
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined1 (*local_2ee8) [32];
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined1 (*local_2ea8) [32];
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined1 (*local_2e68) [32];
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined1 (*local_2e28) [32];
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined1 (*local_2de8) [32];
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined1 (*local_2da8) [32];
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined1 (*local_2d68) [32];
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined1 (*local_2d28) [32];
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined1 (*local_2ce8) [32];
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined1 (*local_2ca8) [32];
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined1 (*local_2c68) [32];
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined1 (*local_2c28) [32];
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined1 (*local_2be8) [32];
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined1 (*local_2ba8) [32];
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined1 (*local_2b68) [32];
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined1 (*local_2b28) [32];
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined1 (*local_2ae8) [32];
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined1 (*local_2aa8) [32];
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined1 (*local_2a68) [32];
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined1 (*local_2a28) [32];
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined1 (*local_29e8) [32];
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined1 (*local_29a8) [32];
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined1 (*local_2968) [32];
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 *local_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined1 (*local_28e8) [32];
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 *local_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 *local_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 *local_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined1 (*local_27e8) [32];
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 *local_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 *local_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 *local_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 *local_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 *local_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 *local_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 *local_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined1 (*local_25e8) [32];
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 *local_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 *local_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 *local_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 *local_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 *local_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 *local_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 *local_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 *local_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 *local_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 *local_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 *local_2328;
  float local_2320;
  float fStack_231c;
  float fStack_2318;
  float fStack_2314;
  float fStack_2310;
  float fStack_230c;
  float fStack_2308;
  float fStack_2304;
  float local_22ec;
  float *local_22e8;
  float local_22e0;
  float fStack_22dc;
  float fStack_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  float fStack_22c8;
  float fStack_22c4;
  float local_22ac;
  float *local_22a8;
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float fStack_2284;
  float local_226c;
  float *local_2268;
  float local_2260;
  float fStack_225c;
  float fStack_2258;
  float fStack_2254;
  float fStack_2250;
  float fStack_224c;
  float fStack_2248;
  float fStack_2244;
  float local_222c;
  float *local_2228;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  float local_21ec;
  float *local_21e8;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  float fStack_21d0;
  float fStack_21cc;
  float fStack_21c8;
  float fStack_21c4;
  float local_21ac;
  float *local_21a8;
  float local_21a0;
  float fStack_219c;
  float fStack_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  float fStack_2188;
  float fStack_2184;
  float local_216c;
  float *local_2168;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  float fStack_2144;
  float local_212c;
  float *local_2128;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float fStack_2104;
  float local_20ec;
  float *local_20e8;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  float local_20ac;
  float *local_20a8;
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  float local_206c;
  float *local_2068;
  float local_2060;
  float fStack_205c;
  float fStack_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float fStack_2048;
  float fStack_2044;
  float local_202c;
  float *local_2028;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  float local_1fec;
  float *local_1fe8;
  float local_1fe0;
  float fStack_1fdc;
  float fStack_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float fStack_1fc8;
  float fStack_1fc4;
  float local_1fac;
  float *local_1fa8;
  float local_1fa0;
  float fStack_1f9c;
  float fStack_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  float fStack_1f84;
  float local_1f6c;
  float *local_1f68;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float fStack_1f48;
  float fStack_1f44;
  float local_1f2c;
  float *local_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  float fStack_1f04;
  float local_1eec;
  float *local_1ee8;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  float local_1eac;
  float *local_1ea8;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  float local_1e6c;
  float *local_1e68;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  float local_1e2c;
  float *local_1e28;
  float local_1e20;
  float fStack_1e1c;
  float fStack_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  float fStack_1e08;
  float fStack_1e04;
  float local_1dec;
  float *local_1de8;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  float local_1dac;
  float *local_1da8;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  float local_1d6c;
  float *local_1d68;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  float local_1d2c;
  float *local_1d28;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  float local_1cec;
  float *local_1ce8;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  float local_1cac;
  float *local_1ca8;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  float local_1c6c;
  float *local_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float local_f60;
  float fStack_f5c;
  float fStack_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float fStack_f48;
  float fStack_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float fStack_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float fStack_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0;
  float fStack_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  float local_da0;
  float fStack_d9c;
  float fStack_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float fStack_d88;
  float fStack_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float fStack_d48;
  float fStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  long local_150;
  undefined4 local_144;
  long local_140;
  long local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  long *local_118;
  undefined4 local_10c;
  long local_108;
  void *local_100;
  undefined4 local_f4;
  int local_f0;
  int local_ec;
  undefined8 *local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined1 (*local_c8) [32];
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  undefined8 *local_b0;
  long *local_a8;
  undefined4 local_9c;
  long local_98;
  void *local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  _c = (int)((ulong)in_stack_ffffffffffffa6a8 >> 0x20);
  local_3c14 = *(int *)((long)in_RDI + 0x2c);
  local_3c18 = *(int *)(in_RDI + 6);
  local_3c1c = *(int *)(in_RDI + 7);
  local_3be8 = &local_3c68;
  local_3c68 = (void *)0x0;
  local_3c60 = (int *)0x0;
  local_3c58 = 0;
  local_3c50 = 0;
  local_3c48 = (long *)0x0;
  local_3c40 = 0;
  local_3c3c = 0;
  local_3c38 = 0;
  local_3c34 = 0;
  local_3c30 = 0;
  local_3c28 = 0;
  _h = (int)in_stack_ffffffffffffa6b0;
  _w = (int)((ulong)in_stack_ffffffffffffa6b0 >> 0x20);
  local_3c08 = in_RCX;
  local_3c00 = in_RDX;
  local_3bf4 = in_ESI;
  local_3bf0 = in_RDI;
  if (local_3c14 < 0xc) {
    if (local_3c14 < 8) {
      if (local_3c14 < 4) {
        if (local_3c14 < 2) {
          Mat::create(in_stack_ffffffffffffa6b8,_w,_h,_c,in_stack_ffffffffffffa6a0,
                      in_stack_ffffffffffffa69c,in_stack_ffffffffffffa718);
        }
        else {
          Mat::create(in_stack_ffffffffffffa6b8,_w,_h,_c,in_stack_ffffffffffffa6a0,
                      in_stack_ffffffffffffa69c,in_stack_ffffffffffffa718);
        }
      }
      else {
        Mat::create(in_stack_ffffffffffffa6b8,_w,_h,_c,in_stack_ffffffffffffa6a0,
                    in_stack_ffffffffffffa69c,in_stack_ffffffffffffa718);
      }
    }
    else {
      Mat::create(in_stack_ffffffffffffa6b8,_w,_h,_c,in_stack_ffffffffffffa6a0,
                  in_stack_ffffffffffffa69c,in_stack_ffffffffffffa718);
    }
  }
  else {
    Mat::create(in_stack_ffffffffffffa6b8,_w,_h,_c,in_stack_ffffffffffffa6a0,
                in_stack_ffffffffffffa69c,in_stack_ffffffffffffa718);
  }
  for (local_3c78 = 0; local_3c78 < local_3c18; local_3c78 = local_3c78 + 1) {
    local_3a18 = &local_3cc0;
    local_3a20 = &local_3c68;
    local_100 = (void *)((long)local_3c68 + local_3c28 * local_3c78 * local_3c58);
    local_e8 = &local_3cc0;
    local_3ca0 = local_3c48;
    local_48 = (long)local_3c3c * (long)local_3c38 * local_3c58;
    local_4c = 0x10;
    local_ec = local_3c3c;
    local_f0 = local_3c38;
    local_f4 = local_3c34;
    local_108 = local_3c58;
    local_10c = local_3c50;
    local_118 = local_3c48;
    local_3a24 = local_3c78;
    local_3a25 = 1;
    for (local_3cc4 = 0; local_3cc4 + 0xb < local_3c14; local_3cc4 = local_3cc4 + 0xc) {
      local_382c = local_3cc4 / 0xc;
      local_3828 = &local_3cc0;
      local_3cd0 = (undefined8 *)
                   ((long)local_100 + (long)local_3c3c * (long)local_382c * local_3c58);
      local_3900 = local_3bf0;
      local_3cd8 = (undefined1 (*) [32])
                   ((long)*local_3bf0 + (long)((local_3c78 * local_3c14 + local_3cc4) * 8) * 4);
      for (local_3cdc = 0; local_3cdc < local_3c1c; local_3cdc = local_3cdc + 1) {
        local_3728 = local_3cd8;
        local_3400 = *(undefined8 *)*local_3cd8;
        uStack_33f8 = *(undefined8 *)(*local_3cd8 + 8);
        uStack_33f0 = *(undefined8 *)(*local_3cd8 + 0x10);
        uStack_33e8 = *(undefined8 *)(*local_3cd8 + 0x18);
        local_3730 = local_3cd8 + 1;
        local_3420 = *(undefined8 *)*local_3730;
        uStack_3418 = *(undefined8 *)(local_3cd8[1] + 8);
        uStack_3410 = *(undefined8 *)(local_3cd8[1] + 0x10);
        uStack_3408 = *(undefined8 *)(local_3cd8[1] + 0x18);
        local_3738 = local_3cd8 + 2;
        local_3440 = *(undefined8 *)*local_3738;
        uStack_3438 = *(undefined8 *)(local_3cd8[2] + 8);
        uStack_3430 = *(undefined8 *)(local_3cd8[2] + 0x10);
        uStack_3428 = *(undefined8 *)(local_3cd8[2] + 0x18);
        local_3740 = local_3cd8 + 3;
        local_3460 = *(undefined8 *)*local_3740;
        uStack_3458 = *(undefined8 *)(local_3cd8[3] + 8);
        uStack_3450 = *(undefined8 *)(local_3cd8[3] + 0x10);
        uStack_3448 = *(undefined8 *)(local_3cd8[3] + 0x18);
        local_3748 = local_3cd8 + 4;
        local_3480 = *(undefined8 *)*local_3748;
        uStack_3478 = *(undefined8 *)(local_3cd8[4] + 8);
        uStack_3470 = *(undefined8 *)(local_3cd8[4] + 0x10);
        uStack_3468 = *(undefined8 *)(local_3cd8[4] + 0x18);
        local_3750 = local_3cd8 + 5;
        local_34a0 = *(undefined8 *)*local_3750;
        uStack_3498 = *(undefined8 *)(local_3cd8[5] + 8);
        uStack_3490 = *(undefined8 *)(local_3cd8[5] + 0x10);
        uStack_3488 = *(undefined8 *)(local_3cd8[5] + 0x18);
        local_3758 = local_3cd8 + 6;
        auVar57 = *(undefined1 (*) [24])*local_3758;
        uStack_34a8 = *(undefined8 *)(local_3cd8[6] + 0x18);
        local_3760 = local_3cd8 + 7;
        auVar58 = *(undefined1 (*) [24])*local_3760;
        uStack_34c8 = *(undefined8 *)(local_3cd8[7] + 0x18);
        local_3768 = local_3cd8 + 8;
        auVar59 = *(undefined1 (*) [24])*local_3768;
        uStack_34e8 = *(undefined8 *)(local_3cd8[8] + 0x18);
        local_3770 = local_3cd8 + 9;
        auVar60 = *(undefined1 (*) [24])*local_3770;
        uStack_3508 = *(undefined8 *)(local_3cd8[9] + 0x18);
        local_3778 = local_3cd8 + 10;
        auVar61 = *(undefined1 (*) [24])*local_3778;
        uStack_3528 = *(undefined8 *)(local_3cd8[10] + 0x18);
        local_3780 = local_3cd8 + 0xb;
        auVar62 = *(undefined1 (*) [24])*local_3780;
        uStack_3548 = *(undefined8 *)(local_3cd8[0xb] + 0x18);
        local_3e80 = vunpcklps_avx(*local_3cd8,*local_3730);
        local_3ea0 = vunpckhps_avx(*local_3cd8,*local_3730);
        local_3ec0 = vunpcklps_avx(*local_3738,*local_3740);
        local_3ee0 = vunpckhps_avx(*local_3738,*local_3740);
        local_3f00 = vunpcklps_avx(*local_3748,*local_3750);
        local_3f20 = vunpckhps_avx(*local_3748,*local_3750);
        local_3dc0._0_8_ = auVar57._0_8_;
        local_34c0 = local_3dc0._0_8_;
        local_3dc0._8_8_ = auVar57._8_8_;
        uStack_34b8 = local_3dc0._8_8_;
        local_3dc0._16_8_ = auVar57._16_8_;
        uStack_34b0 = local_3dc0._16_8_;
        local_3de0._0_8_ = auVar58._0_8_;
        local_34e0 = local_3de0._0_8_;
        local_3de0._8_8_ = auVar58._8_8_;
        uStack_34d8 = local_3de0._8_8_;
        local_3de0._16_8_ = auVar58._16_8_;
        uStack_34d0 = local_3de0._16_8_;
        local_3f40 = vunpcklps_avx(*local_3758,*local_3760);
        local_3180 = local_3dc0._0_8_;
        uStack_3178 = local_3dc0._8_8_;
        uStack_3170 = local_3dc0._16_8_;
        local_31a0 = local_3de0._0_8_;
        uStack_3198 = local_3de0._8_8_;
        uStack_3190 = local_3de0._16_8_;
        local_3f60 = vunpckhps_avx(*local_3758,*local_3760);
        local_3e00._0_8_ = auVar59._0_8_;
        local_3500 = local_3e00._0_8_;
        local_3e00._8_8_ = auVar59._8_8_;
        uStack_34f8 = local_3e00._8_8_;
        local_3e00._16_8_ = auVar59._16_8_;
        uStack_34f0 = local_3e00._16_8_;
        local_3e20._0_8_ = auVar60._0_8_;
        local_3520 = local_3e20._0_8_;
        local_3e20._8_8_ = auVar60._8_8_;
        uStack_3518 = local_3e20._8_8_;
        local_3e20._16_8_ = auVar60._16_8_;
        uStack_3510 = local_3e20._16_8_;
        local_3f80 = vunpcklps_avx(*local_3768,*local_3770);
        local_31c0 = local_3e00._0_8_;
        uStack_31b8 = local_3e00._8_8_;
        uStack_31b0 = local_3e00._16_8_;
        local_31e0 = local_3e20._0_8_;
        uStack_31d8 = local_3e20._8_8_;
        uStack_31d0 = local_3e20._16_8_;
        local_3fa0 = vunpckhps_avx(*local_3768,*local_3770);
        local_3e40._0_8_ = auVar61._0_8_;
        local_3540 = local_3e40._0_8_;
        local_3e40._8_8_ = auVar61._8_8_;
        uStack_3538 = local_3e40._8_8_;
        local_3e40._16_8_ = auVar61._16_8_;
        uStack_3530 = local_3e40._16_8_;
        local_3e60._0_8_ = auVar62._0_8_;
        local_3560 = local_3e60._0_8_;
        local_3e60._8_8_ = auVar62._8_8_;
        uStack_3558 = local_3e60._8_8_;
        local_3e60._16_8_ = auVar62._16_8_;
        uStack_3550 = local_3e60._16_8_;
        local_3fc0 = vunpcklps_avx(*local_3778,*local_3780);
        local_3200 = local_3e40._0_8_;
        uStack_31f8 = local_3e40._8_8_;
        uStack_31f0 = local_3e40._16_8_;
        local_3220 = local_3e60._0_8_;
        uStack_3218 = local_3e60._8_8_;
        uStack_3210 = local_3e60._16_8_;
        local_3fe0 = vunpckhps_avx(*local_3778,*local_3780);
        local_4000 = vunpcklpd_avx(local_3e80,local_3ec0);
        local_4020 = vunpckhpd_avx(local_3e80,local_3ec0);
        local_4040 = vunpcklpd_avx(local_3ea0,local_3ee0);
        local_4060 = vunpckhpd_avx(local_3ea0,local_3ee0);
        local_4080 = vunpcklpd_avx(local_3f00,local_3f40);
        local_40a0 = vunpckhpd_avx(local_3f00,local_3f40);
        local_40c0 = vunpcklpd_avx(local_3f20,local_3f60);
        local_40e0 = vunpckhpd_avx(local_3f20,local_3f60);
        local_4100 = vunpcklpd_avx(local_3f80,local_3fc0);
        local_4120 = vunpckhpd_avx(local_3f80,local_3fc0);
        local_4140 = vunpcklpd_avx(local_3fa0,local_3fe0);
        local_4160 = vunpckhpd_avx(local_3fa0,local_3fe0);
        uStack_3ce8 = local_4080._8_8_;
        uStack_3cf0 = local_4080._0_8_;
        uStack_3cf8 = local_4000._8_8_;
        local_3d00 = local_4000._0_8_;
        uStack_3d08 = local_4020._8_8_;
        uStack_3d10 = local_4020._0_8_;
        uStack_3d18 = local_4100._8_8_;
        local_3d20 = local_4100._0_8_;
        uStack_3d28 = local_4120._8_8_;
        uStack_3d30 = local_4120._0_8_;
        uStack_3d38 = local_40a0._8_8_;
        local_3d40 = local_40a0._0_8_;
        uStack_3d48 = local_40c0._8_8_;
        uStack_3d50 = local_40c0._0_8_;
        uStack_3d58 = local_4040._8_8_;
        local_3d60 = local_4040._0_8_;
        uStack_3d68 = local_4060._8_8_;
        uStack_3d70 = local_4060._0_8_;
        uStack_3d78 = local_4140._8_8_;
        local_3d80 = local_4140._0_8_;
        uStack_3d88 = local_4160._8_8_;
        uStack_3d90 = local_4160._0_8_;
        uStack_3d98 = local_40e0._8_8_;
        local_3da0 = local_40e0._0_8_;
        local_3dc0 = vperm2f128_avx(local_4000,local_4080,0x31);
        local_3de0 = vperm2f128_avx(local_4100,local_4020,0x31);
        local_3e00 = vperm2f128_avx(local_40a0,local_4120,0x31);
        local_3e20 = vperm2f128_avx(local_4040,local_40c0,0x31);
        local_3e40 = vperm2f128_avx(local_4140,local_4060,0x31);
        local_3e60 = vperm2f128_avx(local_40e0,local_4160,0x31);
        local_2328 = local_3cd0;
        *local_3cd0 = local_4000._0_8_;
        local_3cd0[1] = local_4000._8_8_;
        local_3cd0[2] = local_4080._0_8_;
        local_3cd0[3] = local_4080._8_8_;
        local_2368 = local_3cd0 + 4;
        *local_2368 = local_4100._0_8_;
        local_3cd0[5] = local_4100._8_8_;
        local_3cd0[6] = local_4020._0_8_;
        local_3cd0[7] = local_4020._8_8_;
        local_23a8 = local_3cd0 + 8;
        *local_23a8 = local_40a0._0_8_;
        local_3cd0[9] = local_40a0._8_8_;
        local_3cd0[10] = local_4120._0_8_;
        local_3cd0[0xb] = local_4120._8_8_;
        local_23e8 = local_3cd0 + 0xc;
        *local_23e8 = local_4040._0_8_;
        local_3cd0[0xd] = local_4040._8_8_;
        local_3cd0[0xe] = local_40c0._0_8_;
        local_3cd0[0xf] = local_40c0._8_8_;
        local_2428 = local_3cd0 + 0x10;
        *local_2428 = local_4140._0_8_;
        local_3cd0[0x11] = local_4140._8_8_;
        local_3cd0[0x12] = local_4060._0_8_;
        local_3cd0[0x13] = local_4060._8_8_;
        local_2468 = local_3cd0 + 0x14;
        *local_2468 = local_40e0._0_8_;
        local_3cd0[0x15] = local_40e0._8_8_;
        local_3cd0[0x16] = local_4160._0_8_;
        local_3cd0[0x17] = local_4160._8_8_;
        local_24a8 = local_3cd0 + 0x18;
        local_24e0 = local_3dc0._0_8_;
        uStack_24d8 = local_3dc0._8_8_;
        uStack_24d0 = local_3dc0._16_8_;
        uStack_24c8 = local_3dc0._24_8_;
        *local_24a8 = local_3dc0._0_8_;
        local_3cd0[0x19] = local_3dc0._8_8_;
        local_3cd0[0x1a] = local_3dc0._16_8_;
        local_3cd0[0x1b] = local_3dc0._24_8_;
        local_24e8 = local_3cd0 + 0x1c;
        local_2520 = local_3de0._0_8_;
        uStack_2518 = local_3de0._8_8_;
        uStack_2510 = local_3de0._16_8_;
        uStack_2508 = local_3de0._24_8_;
        *local_24e8 = local_3de0._0_8_;
        local_3cd0[0x1d] = local_3de0._8_8_;
        local_3cd0[0x1e] = local_3de0._16_8_;
        local_3cd0[0x1f] = local_3de0._24_8_;
        local_2528 = local_3cd0 + 0x20;
        local_2560 = local_3e00._0_8_;
        uStack_2558 = local_3e00._8_8_;
        uStack_2550 = local_3e00._16_8_;
        uStack_2548 = local_3e00._24_8_;
        *local_2528 = local_3e00._0_8_;
        local_3cd0[0x21] = local_3e00._8_8_;
        local_3cd0[0x22] = local_3e00._16_8_;
        local_3cd0[0x23] = local_3e00._24_8_;
        local_2568 = local_3cd0 + 0x24;
        local_25a0 = local_3e20._0_8_;
        uStack_2598 = local_3e20._8_8_;
        uStack_2590 = local_3e20._16_8_;
        uStack_2588 = local_3e20._24_8_;
        *local_2568 = local_3e20._0_8_;
        local_3cd0[0x25] = local_3e20._8_8_;
        local_3cd0[0x26] = local_3e20._16_8_;
        local_3cd0[0x27] = local_3e20._24_8_;
        local_25a8 = local_3cd0 + 0x28;
        local_25e0 = local_3e40._0_8_;
        uStack_25d8 = local_3e40._8_8_;
        uStack_25d0 = local_3e40._16_8_;
        uStack_25c8 = local_3e40._24_8_;
        *local_25a8 = local_3e40._0_8_;
        local_3cd0[0x29] = local_3e40._8_8_;
        local_3cd0[0x2a] = local_3e40._16_8_;
        local_3cd0[0x2b] = local_3e40._24_8_;
        local_25e8 = (undefined1 (*) [32])(local_3cd0 + 0x2c);
        local_2620 = local_3e60._0_8_;
        uStack_2618 = local_3e60._8_8_;
        uStack_2610 = local_3e60._16_8_;
        uStack_2608 = local_3e60._24_8_;
        *local_25e8 = local_3e60;
        local_3cd0 = local_3cd0 + 0x30;
        local_3cd8 = local_3cd8 + (long)local_3bf0[8];
        uStack_3208 = uStack_3548;
        uStack_31e8 = uStack_3528;
        uStack_31c8 = uStack_3508;
        uStack_31a8 = uStack_34e8;
        uStack_3188 = uStack_34c8;
        uStack_3168 = uStack_34a8;
        local_3160 = local_34a0;
        uStack_3158 = uStack_3498;
        uStack_3150 = uStack_3490;
        uStack_3148 = uStack_3488;
        local_3140 = local_3480;
        uStack_3138 = uStack_3478;
        uStack_3130 = uStack_3470;
        uStack_3128 = uStack_3468;
        local_3120 = local_3460;
        uStack_3118 = uStack_3458;
        uStack_3110 = uStack_3450;
        uStack_3108 = uStack_3448;
        local_3100 = local_3440;
        uStack_30f8 = uStack_3438;
        uStack_30f0 = uStack_3430;
        uStack_30e8 = uStack_3428;
        local_30e0 = local_3420;
        uStack_30d8 = uStack_3418;
        uStack_30d0 = uStack_3410;
        uStack_30c8 = uStack_3408;
        local_30c0 = local_3400;
        uStack_30b8 = uStack_33f8;
        uStack_30b0 = uStack_33f0;
        uStack_30a8 = uStack_33e8;
        local_24a0 = local_3da0;
        uStack_2498 = uStack_3d98;
        uStack_2490 = uStack_3d90;
        uStack_2488 = uStack_3d88;
        local_2460 = local_3d80;
        uStack_2458 = uStack_3d78;
        uStack_2450 = uStack_3d70;
        uStack_2448 = uStack_3d68;
        local_2420 = local_3d60;
        uStack_2418 = uStack_3d58;
        uStack_2410 = uStack_3d50;
        uStack_2408 = uStack_3d48;
        local_23e0 = local_3d40;
        uStack_23d8 = uStack_3d38;
        uStack_23d0 = uStack_3d30;
        uStack_23c8 = uStack_3d28;
        local_23a0 = local_3d20;
        uStack_2398 = uStack_3d18;
        uStack_2390 = uStack_3d10;
        uStack_2388 = uStack_3d08;
        local_2360 = local_3d00;
        uStack_2358 = uStack_3cf8;
        uStack_2350 = uStack_3cf0;
        uStack_2348 = uStack_3ce8;
      }
    }
    for (; local_3cc4 + 7 < local_3c14; local_3cc4 = local_3cc4 + 8) {
      local_383c = local_3cc4 / 0xc +
                   (int)((long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                               (long)local_3cc4 % 0xc & 0xffffffffU) / 8);
      local_3838 = &local_3cc0;
      local_4168 = (undefined8 *)
                   ((long)local_100 + (long)local_3c3c * (long)local_383c * local_3c58);
      local_3908 = local_3bf0;
      local_4170 = (undefined1 (*) [32])
                   ((long)*local_3bf0 + (long)((local_3c78 * local_3c14 + local_3cc4) * 8) * 4);
      for (local_4174 = 0; local_4174 < local_3c1c; local_4174 = local_4174 + 1) {
        local_3788 = local_4170;
        local_3580 = *(undefined8 *)*local_4170;
        uStack_3578 = *(undefined8 *)(*local_4170 + 8);
        uStack_3570 = *(undefined8 *)(*local_4170 + 0x10);
        uStack_3568 = *(undefined8 *)(*local_4170 + 0x18);
        local_3790 = local_4170 + 1;
        local_35a0 = *(undefined8 *)*local_3790;
        uStack_3598 = *(undefined8 *)(local_4170[1] + 8);
        uStack_3590 = *(undefined8 *)(local_4170[1] + 0x10);
        uStack_3588 = *(undefined8 *)(local_4170[1] + 0x18);
        local_3798 = local_4170 + 2;
        local_35c0 = *(undefined8 *)*local_3798;
        uStack_35b8 = *(undefined8 *)(local_4170[2] + 8);
        uStack_35b0 = *(undefined8 *)(local_4170[2] + 0x10);
        uStack_35a8 = *(undefined8 *)(local_4170[2] + 0x18);
        local_37a0 = local_4170 + 3;
        local_35e0 = *(undefined8 *)*local_37a0;
        uStack_35d8 = *(undefined8 *)(local_4170[3] + 8);
        uStack_35d0 = *(undefined8 *)(local_4170[3] + 0x10);
        uStack_35c8 = *(undefined8 *)(local_4170[3] + 0x18);
        local_37a8 = local_4170 + 4;
        auVar57 = *(undefined1 (*) [24])*local_37a8;
        uStack_35e8 = *(undefined8 *)(local_4170[4] + 0x18);
        local_37b0 = local_4170 + 5;
        auVar58 = *(undefined1 (*) [24])*local_37b0;
        uStack_3608 = *(undefined8 *)(local_4170[5] + 0x18);
        local_37b8 = local_4170 + 6;
        auVar59 = *(undefined1 (*) [24])*local_37b8;
        uStack_3628 = *(undefined8 *)(local_4170[6] + 0x18);
        local_37c0 = local_4170 + 7;
        auVar60 = *(undefined1 (*) [24])*local_37c0;
        uStack_3648 = *(undefined8 *)(local_4170[7] + 0x18);
        local_42a0 = vunpcklps_avx(*local_4170,*local_3790);
        local_42c0 = vunpckhps_avx(*local_4170,*local_3790);
        local_42e0 = vunpcklps_avx(*local_3798,*local_37a0);
        local_4300 = vunpckhps_avx(*local_3798,*local_37a0);
        local_4220._0_8_ = auVar57._0_8_;
        local_3600 = local_4220._0_8_;
        local_4220._8_8_ = auVar57._8_8_;
        uStack_35f8 = local_4220._8_8_;
        local_4220._16_8_ = auVar57._16_8_;
        uStack_35f0 = local_4220._16_8_;
        local_4240._0_8_ = auVar58._0_8_;
        local_3620 = local_4240._0_8_;
        local_4240._8_8_ = auVar58._8_8_;
        uStack_3618 = local_4240._8_8_;
        local_4240._16_8_ = auVar58._16_8_;
        uStack_3610 = local_4240._16_8_;
        local_4320 = vunpcklps_avx(*local_37a8,*local_37b0);
        local_32c0 = local_4220._0_8_;
        uStack_32b8 = local_4220._8_8_;
        uStack_32b0 = local_4220._16_8_;
        local_32e0 = local_4240._0_8_;
        uStack_32d8 = local_4240._8_8_;
        uStack_32d0 = local_4240._16_8_;
        local_4340 = vunpckhps_avx(*local_37a8,*local_37b0);
        local_4260._0_8_ = auVar59._0_8_;
        local_3640 = local_4260._0_8_;
        local_4260._8_8_ = auVar59._8_8_;
        uStack_3638 = local_4260._8_8_;
        local_4260._16_8_ = auVar59._16_8_;
        uStack_3630 = local_4260._16_8_;
        local_4280._0_8_ = auVar60._0_8_;
        local_3660 = local_4280._0_8_;
        local_4280._8_8_ = auVar60._8_8_;
        uStack_3658 = local_4280._8_8_;
        local_4280._16_8_ = auVar60._16_8_;
        uStack_3650 = local_4280._16_8_;
        local_4360 = vunpcklps_avx(*local_37b8,*local_37c0);
        local_3300 = local_4260._0_8_;
        uStack_32f8 = local_4260._8_8_;
        uStack_32f0 = local_4260._16_8_;
        local_3320 = local_4280._0_8_;
        uStack_3318 = local_4280._8_8_;
        uStack_3310 = local_4280._16_8_;
        local_4380 = vunpckhps_avx(*local_37b8,*local_37c0);
        local_43a0 = vunpcklpd_avx(local_42a0,local_42e0);
        local_43c0 = vunpckhpd_avx(local_42a0,local_42e0);
        local_43e0 = vunpcklpd_avx(local_42c0,local_4300);
        local_4400 = vunpckhpd_avx(local_42c0,local_4300);
        local_4420 = vunpcklpd_avx(local_4320,local_4360);
        local_4440 = vunpckhpd_avx(local_4320,local_4360);
        local_4460 = vunpcklpd_avx(local_4340,local_4380);
        local_4480 = vunpckhpd_avx(local_4340,local_4380);
        uStack_4188 = local_4420._8_8_;
        uStack_4190 = local_4420._0_8_;
        uStack_4198 = local_43a0._8_8_;
        local_41a0 = local_43a0._0_8_;
        uStack_41a8 = local_4440._8_8_;
        uStack_41b0 = local_4440._0_8_;
        uStack_41b8 = local_43c0._8_8_;
        local_41c0 = local_43c0._0_8_;
        uStack_41c8 = local_4460._8_8_;
        uStack_41d0 = local_4460._0_8_;
        uStack_41d8 = local_43e0._8_8_;
        local_41e0 = local_43e0._0_8_;
        uStack_41e8 = local_4480._8_8_;
        uStack_41f0 = local_4480._0_8_;
        uStack_41f8 = local_4400._8_8_;
        local_4200 = local_4400._0_8_;
        local_4220 = vperm2f128_avx(local_43a0,local_4420,0x31);
        local_4240 = vperm2f128_avx(local_43c0,local_4440,0x31);
        local_4260 = vperm2f128_avx(local_43e0,local_4460,0x31);
        local_4280 = vperm2f128_avx(local_4400,local_4480,0x31);
        local_2628 = local_4168;
        *local_4168 = local_43a0._0_8_;
        local_4168[1] = local_43a0._8_8_;
        local_4168[2] = local_4420._0_8_;
        local_4168[3] = local_4420._8_8_;
        local_2668 = local_4168 + 4;
        *local_2668 = local_43c0._0_8_;
        local_4168[5] = local_43c0._8_8_;
        local_4168[6] = local_4440._0_8_;
        local_4168[7] = local_4440._8_8_;
        local_26a8 = local_4168 + 8;
        *local_26a8 = local_43e0._0_8_;
        local_4168[9] = local_43e0._8_8_;
        local_4168[10] = local_4460._0_8_;
        local_4168[0xb] = local_4460._8_8_;
        local_26e8 = local_4168 + 0xc;
        *local_26e8 = local_4400._0_8_;
        local_4168[0xd] = local_4400._8_8_;
        local_4168[0xe] = local_4480._0_8_;
        local_4168[0xf] = local_4480._8_8_;
        local_2728 = local_4168 + 0x10;
        local_2760 = local_4220._0_8_;
        uStack_2758 = local_4220._8_8_;
        uStack_2750 = local_4220._16_8_;
        uStack_2748 = local_4220._24_8_;
        *local_2728 = local_4220._0_8_;
        local_4168[0x11] = local_4220._8_8_;
        local_4168[0x12] = local_4220._16_8_;
        local_4168[0x13] = local_4220._24_8_;
        local_2768 = local_4168 + 0x14;
        local_27a0 = local_4240._0_8_;
        uStack_2798 = local_4240._8_8_;
        uStack_2790 = local_4240._16_8_;
        uStack_2788 = local_4240._24_8_;
        *local_2768 = local_4240._0_8_;
        local_4168[0x15] = local_4240._8_8_;
        local_4168[0x16] = local_4240._16_8_;
        local_4168[0x17] = local_4240._24_8_;
        local_27a8 = local_4168 + 0x18;
        local_27e0 = local_4260._0_8_;
        uStack_27d8 = local_4260._8_8_;
        uStack_27d0 = local_4260._16_8_;
        uStack_27c8 = local_4260._24_8_;
        *local_27a8 = local_4260._0_8_;
        local_4168[0x19] = local_4260._8_8_;
        local_4168[0x1a] = local_4260._16_8_;
        local_4168[0x1b] = local_4260._24_8_;
        local_27e8 = (undefined1 (*) [32])(local_4168 + 0x1c);
        local_2820 = local_4280._0_8_;
        uStack_2818 = local_4280._8_8_;
        uStack_2810 = local_4280._16_8_;
        uStack_2808 = local_4280._24_8_;
        *local_27e8 = local_4280;
        local_4168 = local_4168 + 0x20;
        local_4170 = local_4170 + (long)local_3bf0[8];
        uStack_3308 = uStack_3648;
        uStack_32e8 = uStack_3628;
        uStack_32c8 = uStack_3608;
        uStack_32a8 = uStack_35e8;
        local_32a0 = local_35e0;
        uStack_3298 = uStack_35d8;
        uStack_3290 = uStack_35d0;
        uStack_3288 = uStack_35c8;
        local_3280 = local_35c0;
        uStack_3278 = uStack_35b8;
        uStack_3270 = uStack_35b0;
        uStack_3268 = uStack_35a8;
        local_3260 = local_35a0;
        uStack_3258 = uStack_3598;
        uStack_3250 = uStack_3590;
        uStack_3248 = uStack_3588;
        local_3240 = local_3580;
        uStack_3238 = uStack_3578;
        uStack_3230 = uStack_3570;
        uStack_3228 = uStack_3568;
        local_2720 = local_4200;
        uStack_2718 = uStack_41f8;
        uStack_2710 = uStack_41f0;
        uStack_2708 = uStack_41e8;
        local_26e0 = local_41e0;
        uStack_26d8 = uStack_41d8;
        uStack_26d0 = uStack_41d0;
        uStack_26c8 = uStack_41c8;
        local_26a0 = local_41c0;
        uStack_2698 = uStack_41b8;
        uStack_2690 = uStack_41b0;
        uStack_2688 = uStack_41a8;
        local_2660 = local_41a0;
        uStack_2658 = uStack_4198;
        uStack_2650 = uStack_4190;
        uStack_2648 = uStack_4188;
      }
    }
    for (; local_3cc4 + 3 < local_3c14; local_3cc4 = local_3cc4 + 4) {
      uVar2 = (long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                    (long)local_3cc4 % 0xc & 0xffffffffU) % 8;
      local_384c = local_3cc4 / 0xc +
                   (int)((long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                               (long)local_3cc4 % 0xc & 0xffffffffU) / 8) +
                   (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 4)
      ;
      local_3848 = &local_3cc0;
      local_4488 = (undefined8 *)
                   ((long)local_100 + (long)local_3c3c * (long)local_384c * local_3c58);
      local_3910 = local_3bf0;
      local_4490 = (undefined1 (*) [32])
                   ((long)*local_3bf0 + (long)((local_3c78 * local_3c14 + local_3cc4) * 8) * 4);
      for (local_4494 = 0; local_4494 < local_3c1c; local_4494 = local_4494 + 1) {
        local_37c8 = local_4490;
        local_3680 = *(undefined8 *)*local_4490;
        uStack_3678 = *(undefined8 *)(*local_4490 + 8);
        uStack_3670 = *(undefined8 *)(*local_4490 + 0x10);
        uStack_3668 = *(undefined8 *)(*local_4490 + 0x18);
        local_37d0 = local_4490 + 1;
        local_36a0 = *(undefined8 *)*local_37d0;
        uStack_3698 = *(undefined8 *)(local_4490[1] + 8);
        uStack_3690 = *(undefined8 *)(local_4490[1] + 0x10);
        uStack_3688 = *(undefined8 *)(local_4490[1] + 0x18);
        local_37d8 = local_4490 + 2;
        auVar57 = *(undefined1 (*) [24])*local_37d8;
        uStack_36a8 = *(undefined8 *)(local_4490[2] + 0x18);
        local_37e0 = local_4490 + 3;
        auVar58 = *(undefined1 (*) [24])*local_37e0;
        uStack_36c8 = *(undefined8 *)(local_4490[3] + 0x18);
        local_4540 = vunpcklps_avx(*local_4490,*local_37d0);
        local_4560 = vunpckhps_avx(*local_4490,*local_37d0);
        local_4500._0_8_ = auVar57._0_8_;
        local_36c0 = local_4500._0_8_;
        local_4500._8_8_ = auVar57._8_8_;
        uStack_36b8 = local_4500._8_8_;
        local_4500._16_8_ = auVar57._16_8_;
        uStack_36b0 = local_4500._16_8_;
        local_4520._0_8_ = auVar58._0_8_;
        local_36e0 = local_4520._0_8_;
        local_4520._8_8_ = auVar58._8_8_;
        uStack_36d8 = local_4520._8_8_;
        local_4520._16_8_ = auVar58._16_8_;
        uStack_36d0 = local_4520._16_8_;
        local_4580 = vunpcklps_avx(*local_37d8,*local_37e0);
        local_3380 = local_4500._0_8_;
        uStack_3378 = local_4500._8_8_;
        uStack_3370 = local_4500._16_8_;
        local_33a0 = local_4520._0_8_;
        uStack_3398 = local_4520._8_8_;
        uStack_3390 = local_4520._16_8_;
        local_45a0 = vunpckhps_avx(*local_37d8,*local_37e0);
        local_45c0 = vunpcklpd_avx(local_4540,local_4580);
        local_45e0 = vunpckhpd_avx(local_4540,local_4580);
        local_4600 = vunpcklpd_avx(local_4560,local_45a0);
        local_4620 = vunpckhpd_avx(local_4560,local_45a0);
        uStack_44a8 = local_45e0._8_8_;
        uStack_44b0 = local_45e0._0_8_;
        uStack_44b8 = local_45c0._8_8_;
        local_44c0 = local_45c0._0_8_;
        uStack_44c8 = local_4620._8_8_;
        uStack_44d0 = local_4620._0_8_;
        uStack_44d8 = local_4600._8_8_;
        local_44e0 = local_4600._0_8_;
        local_4500 = vperm2f128_avx(local_45c0,local_45e0,0x31);
        local_4520 = vperm2f128_avx(local_4600,local_4620,0x31);
        local_2828 = local_4488;
        *local_4488 = local_45c0._0_8_;
        local_4488[1] = local_45c0._8_8_;
        local_4488[2] = local_45e0._0_8_;
        local_4488[3] = local_45e0._8_8_;
        local_2868 = local_4488 + 4;
        *local_2868 = local_4600._0_8_;
        local_4488[5] = local_4600._8_8_;
        local_4488[6] = local_4620._0_8_;
        local_4488[7] = local_4620._8_8_;
        local_28a8 = local_4488 + 8;
        local_28e0 = local_4500._0_8_;
        uStack_28d8 = local_4500._8_8_;
        uStack_28d0 = local_4500._16_8_;
        uStack_28c8 = local_4500._24_8_;
        *local_28a8 = local_4500._0_8_;
        local_4488[9] = local_4500._8_8_;
        local_4488[10] = local_4500._16_8_;
        local_4488[0xb] = local_4500._24_8_;
        local_28e8 = (undefined1 (*) [32])(local_4488 + 0xc);
        local_2920 = local_4520._0_8_;
        uStack_2918 = local_4520._8_8_;
        uStack_2910 = local_4520._16_8_;
        uStack_2908 = local_4520._24_8_;
        *local_28e8 = local_4520;
        local_4488 = local_4488 + 0x10;
        local_4490 = local_4490 + (long)local_3bf0[8];
        uStack_3388 = uStack_36c8;
        uStack_3368 = uStack_36a8;
        local_3360 = local_36a0;
        uStack_3358 = uStack_3698;
        uStack_3350 = uStack_3690;
        uStack_3348 = uStack_3688;
        local_3340 = local_3680;
        uStack_3338 = uStack_3678;
        uStack_3330 = uStack_3670;
        uStack_3328 = uStack_3668;
        local_28a0 = local_44e0;
        uStack_2898 = uStack_44d8;
        uStack_2890 = uStack_44d0;
        uStack_2888 = uStack_44c8;
        local_2860 = local_44c0;
        uStack_2858 = uStack_44b8;
        uStack_2850 = uStack_44b0;
        uStack_2848 = uStack_44a8;
      }
    }
    for (; local_3cc4 + 1 < local_3c14; local_3cc4 = local_3cc4 + 2) {
      uVar2 = (long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                    (long)local_3cc4 % 0xc & 0xffffffffU) % 8;
      uVar3 = (long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                    (long)local_3cc4 % 0xc & 0xffffffffU) % 4;
      local_385c = local_3cc4 / 0xc +
                   (int)((long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                               (long)local_3cc4 % 0xc & 0xffffffffU) / 8) +
                   (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 4)
                   + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                          2);
      local_3858 = &local_3cc0;
      local_4628 = (undefined8 *)
                   ((long)local_100 + (long)local_3c3c * (long)local_385c * local_3c58);
      local_3918 = local_3bf0;
      local_4630 = (undefined1 (*) [32])
                   ((long)*local_3bf0 + (long)((local_3c78 * local_3c14 + local_3cc4) * 8) * 4);
      for (local_4634 = 0; local_4634 < local_3c1c; local_4634 = local_4634 + 1) {
        local_37e8 = local_4630;
        local_3700 = *(undefined8 *)*local_4630;
        uStack_36f8 = *(undefined8 *)(*local_4630 + 8);
        uStack_36f0 = *(undefined8 *)(*local_4630 + 0x10);
        uStack_36e8 = *(undefined8 *)(*local_4630 + 0x18);
        local_37f0 = local_4630 + 1;
        auVar57 = *(undefined1 (*) [24])*local_37f0;
        uStack_3708 = *(undefined8 *)(local_4630[1] + 0x18);
        local_4680._0_8_ = auVar57._0_8_;
        local_3720 = local_4680._0_8_;
        local_4680._8_8_ = auVar57._8_8_;
        uStack_3718 = local_4680._8_8_;
        local_4680._16_8_ = auVar57._16_8_;
        uStack_3710 = local_4680._16_8_;
        local_46a0 = vunpcklps_avx(*local_4630,*local_37f0);
        local_33e0 = local_4680._0_8_;
        uStack_33d8 = local_4680._8_8_;
        uStack_33d0 = local_4680._16_8_;
        local_46c0 = vunpckhps_avx(*local_4630,*local_37f0);
        uStack_4648 = local_46c0._8_8_;
        uStack_4650 = local_46c0._0_8_;
        uStack_4658 = local_46a0._8_8_;
        local_4660 = local_46a0._0_8_;
        local_4680 = vperm2f128_avx(local_46a0,local_46c0,0x31);
        local_2928 = local_4628;
        local_2960 = local_46a0._0_8_;
        uStack_2958 = local_46a0._8_8_;
        uStack_2950 = local_46c0._0_8_;
        uStack_2948 = local_46c0._8_8_;
        *local_4628 = local_46a0._0_8_;
        local_4628[1] = local_46a0._8_8_;
        local_4628[2] = local_46c0._0_8_;
        local_4628[3] = local_46c0._8_8_;
        local_2968 = (undefined1 (*) [32])(local_4628 + 4);
        local_29a0 = local_4680._0_8_;
        uStack_2998 = local_4680._8_8_;
        uStack_2990 = local_4680._16_8_;
        uStack_2988 = local_4680._24_8_;
        *local_2968 = local_4680;
        local_4628 = local_4628 + 8;
        local_4630 = local_4630 + (long)local_3bf0[8];
        uStack_33c8 = uStack_3708;
        local_33c0 = local_3700;
        uStack_33b8 = uStack_36f8;
        uStack_33b0 = uStack_36f0;
        uStack_33a8 = uStack_36e8;
      }
    }
    for (; local_3cc4 < local_3c14; local_3cc4 = local_3cc4 + 1) {
      uVar2 = (long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                    (long)local_3cc4 % 0xc & 0xffffffffU) % 8;
      uVar3 = (long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                    (long)local_3cc4 % 0xc & 0xffffffffU) % 4;
      local_386c = local_3cc4 / 0xc +
                   (int)((long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                               (long)local_3cc4 % 0xc & 0xffffffffU) / 8) +
                   (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 4)
                   + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                          2) +
                   (int)((long)((ulong)(uint)((int)((long)local_3cc4 % 0xc) >> 0x1f) << 0x20 |
                               (long)local_3cc4 % 0xc & 0xffffffffU) % 2);
      local_3868 = &local_3cc0;
      local_46c8 = (undefined1 (*) [32])
                   ((long)local_100 + (long)local_3c3c * (long)local_386c * local_3c58);
      local_3920 = local_3bf0;
      local_46d0 = (undefined1 (*) [32])
                   ((long)*local_3bf0 + (long)((local_3c78 * local_3c14 + local_3cc4) * 8) * 4);
      for (local_46d4 = 0; local_46d4 < local_3c1c; local_46d4 = local_46d4 + 1) {
        local_37f8 = local_46d0;
        local_4700 = *(undefined8 *)*local_46d0;
        uStack_46f8 = *(undefined8 *)(*local_46d0 + 8);
        uStack_46f0 = *(undefined8 *)(*local_46d0 + 0x10);
        uStack_46e8 = *(undefined8 *)(*local_46d0 + 0x18);
        local_29a8 = local_46c8;
        *local_46c8 = *local_46d0;
        local_46c8 = local_46c8 + 1;
        local_46d0 = local_46d0 + (long)local_3bf0[8];
        local_29e0 = local_4700;
        uStack_29d8 = uStack_46f8;
        uStack_29d0 = uStack_46f0;
        uStack_29c8 = uStack_46e8;
      }
    }
    local_3bd8 = &local_3cc0;
    local_3cc0 = 0;
    local_3cb0 = 0;
    local_3ca8 = 0;
    local_3c98 = 0;
    local_3c94 = 0;
    local_3c90 = 0;
    local_3c8c = 0;
    local_3c88 = 0;
    local_3c80 = 0;
    local_3cb8 = 0;
    local_3a90 = local_3bd8;
  }
  local_3be0 = &local_4748;
  local_4748 = (void *)0x0;
  local_4740 = (int *)0x0;
  local_4738 = 0;
  local_4730 = 0;
  local_4728 = (long *)0x0;
  local_4720 = 0;
  local_471c = 0;
  local_4718 = 0;
  local_4714 = 0;
  local_4710 = 0;
  local_4708 = 0;
  local_3b68 = local_3bf0;
  local_3b70 = &local_4748;
  if (local_3bf0 != local_3b70) {
    local_3b50 = local_3bf0;
    if (local_3bf0[1] != (void *)0x0) {
      piVar1 = (int *)local_3bf0[1];
      local_3b54 = 0xffffffff;
      LOCK();
      local_3b58 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_3b58 == 1) {
        if (local_3bf0[4] == (void *)0x0) {
          local_3878 = *local_3bf0;
          if (local_3878 != (void *)0x0) {
            free(local_3878);
          }
        }
        else {
          (**(code **)(*local_3bf0[4] + 0x18))(local_3bf0[4],*local_3bf0);
        }
      }
    }
    *local_3bf0 = (void *)0x0;
    local_3bf0[2] = (void *)0x0;
    *(undefined4 *)(local_3bf0 + 3) = 0;
    *(undefined4 *)(local_3bf0 + 5) = 0;
    *(undefined4 *)((long)local_3bf0 + 0x2c) = 0;
    *(undefined4 *)(local_3bf0 + 6) = 0;
    *(undefined4 *)((long)local_3bf0 + 0x34) = 0;
    *(undefined4 *)(local_3bf0 + 7) = 0;
    local_3bf0[8] = (void *)0x0;
    local_3bf0[1] = (void *)0x0;
    *local_3bf0 = *local_3b70;
    local_3bf0[1] = local_3b70[1];
    local_3bf0[2] = local_3b70[2];
    *(undefined4 *)(local_3bf0 + 3) = *(undefined4 *)(local_3b70 + 3);
    local_3bf0[4] = local_3b70[4];
    *(undefined4 *)(local_3bf0 + 5) = *(undefined4 *)(local_3b70 + 5);
    *(undefined4 *)((long)local_3bf0 + 0x2c) = *(undefined4 *)((long)local_3b70 + 0x2c);
    *(undefined4 *)(local_3bf0 + 6) = *(undefined4 *)(local_3b70 + 6);
    *(undefined4 *)((long)local_3bf0 + 0x34) = *(undefined4 *)((long)local_3b70 + 0x34);
    *(undefined4 *)(local_3bf0 + 7) = *(undefined4 *)(local_3b70 + 7);
    local_3bf0[8] = local_3b70[8];
  }
  local_3bc8 = &local_4748;
  local_3ab0 = local_3bc8;
  if (local_4740 != (int *)0x0) {
    local_3ab4 = 0xffffffff;
    LOCK();
    local_3ab8 = *local_4740;
    *local_4740 = *local_4740 + -1;
    UNLOCK();
    if (local_3ab8 == 1) {
      if (local_4728 == (long *)0x0) {
        local_38c8 = local_4748;
        if (local_4748 != (void *)0x0) {
          free(local_4748);
        }
      }
      else {
        (**(code **)(*local_4728 + 0x18))(local_4728,local_4748);
      }
    }
  }
  local_4748 = (void *)0x0;
  local_4738 = 0;
  local_4730 = 0;
  local_4720 = 0;
  local_471c = 0;
  local_4718 = 0;
  local_4714 = 0;
  local_4710 = 0;
  local_4708 = 0;
  local_4740 = (int *)0x0;
  Mat::create(in_stack_ffffffffffffa6b8,(int)((ulong)in_stack_ffffffffffffa6b0 >> 0x20),
              (int)in_stack_ffffffffffffa6b0,_c,in_stack_ffffffffffffa6a0,in_stack_ffffffffffffa69c,
              in_stack_ffffffffffffa718);
  for (local_474c = 0; local_474c < local_3bf4; local_474c = local_474c + 1) {
    local_3a48 = &local_47a0;
    local_b4 = *(int *)((long)local_3c08 + 0x2c);
    local_b8 = (int)local_3c08[6];
    local_bc = *(undefined4 *)((long)local_3c08 + 0x34);
    local_c8 = (undefined1 (*) [32])(*local_3c08 + local_3c08[8] * (long)local_474c * local_3c08[2])
    ;
    local_d0 = local_3c08[2];
    local_d4 = (undefined4)local_3c08[3];
    local_e0 = local_3c08[4];
    local_b0 = &local_47a0;
    local_58 = (long)local_b4 * (long)local_b8 * local_d0;
    local_39f8 = &local_47a0;
    local_3bb8 = &local_47a0;
    local_5c = 0x10;
    local_3940 = &local_47e8;
    local_124 = *(int *)((long)local_3c00 + 0x2c);
    local_128 = (int)local_3c00[6];
    local_12c = *(undefined4 *)((long)local_3c00 + 0x34);
    local_138 = *local_3c00 + local_3c00[8] * (long)local_474c * local_3c00[2];
    local_140 = local_3c00[2];
    local_144 = (undefined4)local_3c00[3];
    local_150 = local_3c00[4];
    local_120 = &local_47e8;
    local_38 = (long)local_124 * (long)local_128 * local_140;
    local_3c = 0x10;
    local_4758 = local_c8;
    for (local_47ec = 0; local_47ec < local_3c18; local_47ec = local_47ec + 1) {
      local_3a78 = &local_4838;
      local_3a80 = &local_3c68;
      local_90 = (void *)((long)local_3c68 + local_3c28 * local_47ec * local_3c58);
      local_78 = &local_4838;
      local_68 = (long)local_3c3c * (long)local_3c38 * local_3c58;
      for (local_483c = 0; local_483c + 0xb < local_3c14; local_483c = local_483c + 0xc) {
        local_395c = local_483c / 0xc;
        local_3958 = &local_4838;
        local_4848 = (float *)((long)local_90 + (long)local_3c3c * (long)local_395c * local_3c58);
        local_396c = local_47ec;
        local_3968 = &local_47e8;
        local_4850 = (undefined8 *)(local_138 + (long)local_124 * (long)local_47ec * local_140);
        local_180 = 0;
        uStack_178 = 0;
        uStack_170 = 0;
        uStack_168 = 0;
        local_4880 = 0;
        uStack_4878 = 0;
        uStack_4870 = 0;
        uStack_4868 = 0;
        local_1a0._8_8_ = SUB328(ZEXT832(0),4);
        local_48a0 = 0;
        uStack_4898 = local_1a0._8_8_;
        uStack_4890 = 0;
        uStack_4888 = 0;
        local_1c0._8_8_ = SUB328(ZEXT832(0),4);
        local_48c0 = 0;
        uStack_48b8 = local_1c0._8_8_;
        uStack_48b0 = 0;
        uStack_48a8 = 0;
        local_1e0._8_8_ = SUB328(ZEXT832(0),4);
        local_48e0 = 0;
        uStack_48d8 = local_1e0._8_8_;
        uStack_48d0 = 0;
        uStack_48c8 = 0;
        local_200._8_8_ = SUB328(ZEXT832(0),4);
        local_4900 = 0;
        uStack_48f8 = local_200._8_8_;
        uStack_48f0 = 0;
        uStack_48e8 = 0;
        local_220._8_8_ = SUB328(ZEXT832(0),4);
        local_4920 = 0;
        uStack_4918 = local_220._8_8_;
        uStack_4910 = 0;
        uStack_4908 = 0;
        local_240._8_8_ = SUB328(ZEXT832(0),4);
        local_4940 = 0;
        uStack_4938 = local_240._8_8_;
        uStack_4930 = 0;
        uStack_4928 = 0;
        local_260._8_8_ = SUB328(ZEXT832(0),4);
        local_4960 = 0;
        uStack_4958 = local_260._8_8_;
        uStack_4950 = 0;
        uStack_4948 = 0;
        local_280._8_8_ = SUB328(ZEXT832(0),4);
        local_4980 = 0;
        uStack_4978 = local_280._8_8_;
        uStack_4970 = 0;
        uStack_4968 = 0;
        local_2a0._8_8_ = SUB328(ZEXT832(0),4);
        local_49a0 = 0;
        uStack_4998 = local_2a0._8_8_;
        uStack_4990 = 0;
        uStack_4988 = 0;
        local_2c0._8_8_ = SUB328(ZEXT832(0),4);
        local_49c0 = 0;
        uStack_49b8 = local_2c0._8_8_;
        uStack_49b0 = 0;
        uStack_49a8 = 0;
        local_2e0._8_8_ = SUB328(ZEXT832(0),4);
        local_49e0 = 0;
        uStack_49d8 = local_2e0._8_8_;
        uStack_49d0 = 0;
        uStack_49c8 = 0;
        for (local_49e4 = 0; local_49e4 < local_3c1c << 3; local_49e4 = local_49e4 + 1) {
          local_3800 = local_4850;
          local_16a0 = *local_4850;
          uStack_1698 = local_4850[1];
          uStack_1690 = local_4850[2];
          uStack_1688 = local_4850[3];
          local_1c68 = local_4848;
          local_1ca0 = *local_4848;
          local_1260 = CONCAT44(local_1ca0,local_1ca0);
          uStack_1258 = CONCAT44(local_1ca0,local_1ca0);
          uStack_1250 = CONCAT44(local_1ca0,local_1ca0);
          uStack_1248 = CONCAT44(local_1ca0,local_1ca0);
          local_1ca8 = local_4848 + 1;
          local_1ce0 = *local_1ca8;
          local_12c0 = CONCAT44(local_1ce0,local_1ce0);
          uStack_12b8 = CONCAT44(local_1ce0,local_1ce0);
          uStack_12b0 = CONCAT44(local_1ce0,local_1ce0);
          uStack_12a8 = CONCAT44(local_1ce0,local_1ce0);
          local_12a0 = local_4880;
          uStack_1298 = uStack_4878;
          uStack_1290 = uStack_4870;
          uStack_1288 = uStack_4868;
          local_b80._0_4_ = (float)local_16a0;
          local_b80._4_4_ = (float)((ulong)local_16a0 >> 0x20);
          uStack_b78._0_4_ = (float)uStack_1698;
          uStack_b78._4_4_ = (float)((ulong)uStack_1698 >> 0x20);
          uStack_b70._0_4_ = (float)uStack_1690;
          uStack_b70._4_4_ = (float)((ulong)uStack_1690 >> 0x20);
          uStack_b68._0_4_ = (float)uStack_1688;
          local_1220 = local_1ca0 * (float)local_b80;
          fStack_121c = local_1ca0 * local_b80._4_4_;
          fStack_1218 = local_1ca0 * (float)uStack_b78;
          fStack_1214 = local_1ca0 * uStack_b78._4_4_;
          fStack_1210 = local_1ca0 * (float)uStack_b70;
          fStack_120c = local_1ca0 * uStack_b70._4_4_;
          fStack_1208 = local_1ca0 * (float)uStack_b68;
          uVar4 = local_4880;
          uVar5 = uStack_4878;
          uVar6 = uStack_4870;
          uVar7 = uStack_4868;
          local_1240._0_4_ = (float)local_4880;
          local_1240._4_4_ = (float)((ulong)local_4880 >> 0x20);
          uStack_1238._0_4_ = (float)uStack_4878;
          uStack_1238._4_4_ = (float)((ulong)uStack_4878 >> 0x20);
          uStack_1230._0_4_ = (float)uStack_4870;
          uStack_1230._4_4_ = (float)((ulong)uStack_4870 >> 0x20);
          uStack_1228._0_4_ = (float)uStack_4868;
          uStack_1228._4_4_ = (float)((ulong)uStack_4868 >> 0x20);
          local_4880 = CONCAT44(fStack_121c + local_1240._4_4_,local_1220 + (float)local_1240);
          uStack_4878 = CONCAT44(fStack_1214 + uStack_1238._4_4_,fStack_1218 + (float)uStack_1238);
          uStack_4870 = CONCAT44(fStack_120c + uStack_1230._4_4_,fStack_1210 + (float)uStack_1230);
          uStack_4868 = CONCAT44(local_1ca0 + uStack_1228._4_4_,fStack_1208 + (float)uStack_1228);
          local_1300 = local_48a0;
          uStack_12f8 = uStack_4898;
          uStack_12f0 = uStack_4890;
          uStack_12e8 = uStack_4888;
          local_11e0 = local_1ce0 * (float)local_b80;
          fStack_11dc = local_1ce0 * local_b80._4_4_;
          fStack_11d8 = local_1ce0 * (float)uStack_b78;
          fStack_11d4 = local_1ce0 * uStack_b78._4_4_;
          fStack_11d0 = local_1ce0 * (float)uStack_b70;
          fStack_11cc = local_1ce0 * uStack_b70._4_4_;
          fStack_11c8 = local_1ce0 * (float)uStack_b68;
          uVar8 = local_48a0;
          uVar9 = uStack_4898;
          uVar10 = uStack_4890;
          uVar11 = uStack_4888;
          local_1200._0_4_ = (float)local_48a0;
          local_1200._4_4_ = (float)((ulong)local_48a0 >> 0x20);
          uStack_11f8._0_4_ = (float)uStack_4898;
          uStack_11f8._4_4_ = (float)((ulong)uStack_4898 >> 0x20);
          uStack_11f0._0_4_ = (float)uStack_4890;
          uStack_11f0._4_4_ = (float)((ulong)uStack_4890 >> 0x20);
          uStack_11e8._0_4_ = (float)uStack_4888;
          uStack_11e8._4_4_ = (float)((ulong)uStack_4888 >> 0x20);
          local_48a0 = CONCAT44(fStack_11dc + local_1200._4_4_,local_11e0 + (float)local_1200);
          uStack_4898 = CONCAT44(fStack_11d4 + uStack_11f8._4_4_,fStack_11d8 + (float)uStack_11f8);
          uStack_4890 = CONCAT44(fStack_11cc + uStack_11f0._4_4_,fStack_11d0 + (float)uStack_11f0);
          uStack_4888 = CONCAT44(local_1ce0 + uStack_11e8._4_4_,fStack_11c8 + (float)uStack_11e8);
          local_1ce8 = local_4848 + 2;
          local_1d20 = *local_1ce8;
          local_1320 = CONCAT44(local_1d20,local_1d20);
          uStack_1318 = CONCAT44(local_1d20,local_1d20);
          uStack_1310 = CONCAT44(local_1d20,local_1d20);
          uStack_1308 = CONCAT44(local_1d20,local_1d20);
          local_1d28 = local_4848 + 3;
          local_1d60 = *local_1d28;
          local_1380 = CONCAT44(local_1d60,local_1d60);
          uStack_1378 = CONCAT44(local_1d60,local_1d60);
          uStack_1370 = CONCAT44(local_1d60,local_1d60);
          uStack_1368 = CONCAT44(local_1d60,local_1d60);
          local_1360 = local_48c0;
          uStack_1358 = uStack_48b8;
          uStack_1350 = uStack_48b0;
          uStack_1348 = uStack_48a8;
          local_11a0 = local_1d20 * (float)local_b80;
          fStack_119c = local_1d20 * local_b80._4_4_;
          fStack_1198 = local_1d20 * (float)uStack_b78;
          fStack_1194 = local_1d20 * uStack_b78._4_4_;
          fStack_1190 = local_1d20 * (float)uStack_b70;
          fStack_118c = local_1d20 * uStack_b70._4_4_;
          fStack_1188 = local_1d20 * (float)uStack_b68;
          uVar12 = local_48c0;
          uVar13 = uStack_48b8;
          uVar14 = uStack_48b0;
          uVar15 = uStack_48a8;
          local_11c0._0_4_ = (float)local_48c0;
          local_11c0._4_4_ = (float)((ulong)local_48c0 >> 0x20);
          uStack_11b8._0_4_ = (float)uStack_48b8;
          uStack_11b8._4_4_ = (float)((ulong)uStack_48b8 >> 0x20);
          uStack_11b0._0_4_ = (float)uStack_48b0;
          uStack_11b0._4_4_ = (float)((ulong)uStack_48b0 >> 0x20);
          uStack_11a8._0_4_ = (float)uStack_48a8;
          uStack_11a8._4_4_ = (float)((ulong)uStack_48a8 >> 0x20);
          local_48c0 = CONCAT44(fStack_119c + local_11c0._4_4_,local_11a0 + (float)local_11c0);
          uStack_48b8 = CONCAT44(fStack_1194 + uStack_11b8._4_4_,fStack_1198 + (float)uStack_11b8);
          uStack_48b0 = CONCAT44(fStack_118c + uStack_11b0._4_4_,fStack_1190 + (float)uStack_11b0);
          uStack_48a8 = CONCAT44(local_1d20 + uStack_11a8._4_4_,fStack_1188 + (float)uStack_11a8);
          local_13c0 = local_48e0;
          uStack_13b8 = uStack_48d8;
          uStack_13b0 = uStack_48d0;
          uStack_13a8 = uStack_48c8;
          local_1160 = local_1d60 * (float)local_b80;
          fStack_115c = local_1d60 * local_b80._4_4_;
          fStack_1158 = local_1d60 * (float)uStack_b78;
          fStack_1154 = local_1d60 * uStack_b78._4_4_;
          fStack_1150 = local_1d60 * (float)uStack_b70;
          fStack_114c = local_1d60 * uStack_b70._4_4_;
          fStack_1148 = local_1d60 * (float)uStack_b68;
          uVar16 = local_48e0;
          uVar17 = uStack_48d8;
          uVar18 = uStack_48d0;
          uVar19 = uStack_48c8;
          local_1180._0_4_ = (float)local_48e0;
          local_1180._4_4_ = (float)((ulong)local_48e0 >> 0x20);
          uStack_1178._0_4_ = (float)uStack_48d8;
          uStack_1178._4_4_ = (float)((ulong)uStack_48d8 >> 0x20);
          uStack_1170._0_4_ = (float)uStack_48d0;
          uStack_1170._4_4_ = (float)((ulong)uStack_48d0 >> 0x20);
          uStack_1168._0_4_ = (float)uStack_48c8;
          uStack_1168._4_4_ = (float)((ulong)uStack_48c8 >> 0x20);
          local_48e0 = CONCAT44(fStack_115c + local_1180._4_4_,local_1160 + (float)local_1180);
          uStack_48d8 = CONCAT44(fStack_1154 + uStack_1178._4_4_,fStack_1158 + (float)uStack_1178);
          uStack_48d0 = CONCAT44(fStack_114c + uStack_1170._4_4_,fStack_1150 + (float)uStack_1170);
          uStack_48c8 = CONCAT44(local_1d60 + uStack_1168._4_4_,fStack_1148 + (float)uStack_1168);
          local_1d68 = local_4848 + 4;
          local_1da0 = *local_1d68;
          local_13e0 = CONCAT44(local_1da0,local_1da0);
          uStack_13d8 = CONCAT44(local_1da0,local_1da0);
          uStack_13d0 = CONCAT44(local_1da0,local_1da0);
          uStack_13c8 = CONCAT44(local_1da0,local_1da0);
          local_1da8 = local_4848 + 5;
          local_1de0 = *local_1da8;
          local_1440 = CONCAT44(local_1de0,local_1de0);
          uStack_1438 = CONCAT44(local_1de0,local_1de0);
          uStack_1430 = CONCAT44(local_1de0,local_1de0);
          uStack_1428 = CONCAT44(local_1de0,local_1de0);
          local_1420 = local_4900;
          uStack_1418 = uStack_48f8;
          uStack_1410 = uStack_48f0;
          uStack_1408 = uStack_48e8;
          local_1120 = local_1da0 * (float)local_b80;
          fStack_111c = local_1da0 * local_b80._4_4_;
          fStack_1118 = local_1da0 * (float)uStack_b78;
          fStack_1114 = local_1da0 * uStack_b78._4_4_;
          fStack_1110 = local_1da0 * (float)uStack_b70;
          fStack_110c = local_1da0 * uStack_b70._4_4_;
          fStack_1108 = local_1da0 * (float)uStack_b68;
          uVar20 = local_4900;
          uVar21 = uStack_48f8;
          uVar22 = uStack_48f0;
          uVar23 = uStack_48e8;
          local_1140._0_4_ = (float)local_4900;
          local_1140._4_4_ = (float)((ulong)local_4900 >> 0x20);
          uStack_1138._0_4_ = (float)uStack_48f8;
          uStack_1138._4_4_ = (float)((ulong)uStack_48f8 >> 0x20);
          uStack_1130._0_4_ = (float)uStack_48f0;
          uStack_1130._4_4_ = (float)((ulong)uStack_48f0 >> 0x20);
          uStack_1128._0_4_ = (float)uStack_48e8;
          uStack_1128._4_4_ = (float)((ulong)uStack_48e8 >> 0x20);
          local_4900 = CONCAT44(fStack_111c + local_1140._4_4_,local_1120 + (float)local_1140);
          uStack_48f8 = CONCAT44(fStack_1114 + uStack_1138._4_4_,fStack_1118 + (float)uStack_1138);
          uStack_48f0 = CONCAT44(fStack_110c + uStack_1130._4_4_,fStack_1110 + (float)uStack_1130);
          uStack_48e8 = CONCAT44(local_1da0 + uStack_1128._4_4_,fStack_1108 + (float)uStack_1128);
          local_1480 = local_4920;
          uStack_1478 = uStack_4918;
          uStack_1470 = uStack_4910;
          uStack_1468 = uStack_4908;
          local_10e0 = local_1de0 * (float)local_b80;
          fStack_10dc = local_1de0 * local_b80._4_4_;
          fStack_10d8 = local_1de0 * (float)uStack_b78;
          fStack_10d4 = local_1de0 * uStack_b78._4_4_;
          fStack_10d0 = local_1de0 * (float)uStack_b70;
          fStack_10cc = local_1de0 * uStack_b70._4_4_;
          fStack_10c8 = local_1de0 * (float)uStack_b68;
          uVar24 = local_4920;
          uVar25 = uStack_4918;
          uVar26 = uStack_4910;
          uVar27 = uStack_4908;
          local_1100._0_4_ = (float)local_4920;
          local_1100._4_4_ = (float)((ulong)local_4920 >> 0x20);
          uStack_10f8._0_4_ = (float)uStack_4918;
          uStack_10f8._4_4_ = (float)((ulong)uStack_4918 >> 0x20);
          uStack_10f0._0_4_ = (float)uStack_4910;
          uStack_10f0._4_4_ = (float)((ulong)uStack_4910 >> 0x20);
          uStack_10e8._0_4_ = (float)uStack_4908;
          uStack_10e8._4_4_ = (float)((ulong)uStack_4908 >> 0x20);
          local_4920 = CONCAT44(fStack_10dc + local_1100._4_4_,local_10e0 + (float)local_1100);
          uStack_4918 = CONCAT44(fStack_10d4 + uStack_10f8._4_4_,fStack_10d8 + (float)uStack_10f8);
          uStack_4910 = CONCAT44(fStack_10cc + uStack_10f0._4_4_,fStack_10d0 + (float)uStack_10f0);
          uStack_4908 = CONCAT44(local_1de0 + uStack_10e8._4_4_,fStack_10c8 + (float)uStack_10e8);
          local_1de8 = local_4848 + 6;
          local_1e20 = *local_1de8;
          local_14a0 = CONCAT44(local_1e20,local_1e20);
          uStack_1498 = CONCAT44(local_1e20,local_1e20);
          uStack_1490 = CONCAT44(local_1e20,local_1e20);
          uStack_1488 = CONCAT44(local_1e20,local_1e20);
          local_1e28 = local_4848 + 7;
          local_1e60 = *local_1e28;
          local_1500 = CONCAT44(local_1e60,local_1e60);
          uStack_14f8 = CONCAT44(local_1e60,local_1e60);
          uStack_14f0 = CONCAT44(local_1e60,local_1e60);
          uStack_14e8 = CONCAT44(local_1e60,local_1e60);
          local_14e0 = local_4940;
          uStack_14d8 = uStack_4938;
          uStack_14d0 = uStack_4930;
          uStack_14c8 = uStack_4928;
          local_10a0 = local_1e20 * (float)local_b80;
          fStack_109c = local_1e20 * local_b80._4_4_;
          fStack_1098 = local_1e20 * (float)uStack_b78;
          fStack_1094 = local_1e20 * uStack_b78._4_4_;
          fStack_1090 = local_1e20 * (float)uStack_b70;
          fStack_108c = local_1e20 * uStack_b70._4_4_;
          fStack_1088 = local_1e20 * (float)uStack_b68;
          uVar28 = local_4940;
          uVar29 = uStack_4938;
          uVar30 = uStack_4930;
          uVar31 = uStack_4928;
          local_10c0._0_4_ = (float)local_4940;
          local_10c0._4_4_ = (float)((ulong)local_4940 >> 0x20);
          uStack_10b8._0_4_ = (float)uStack_4938;
          uStack_10b8._4_4_ = (float)((ulong)uStack_4938 >> 0x20);
          uStack_10b0._0_4_ = (float)uStack_4930;
          uStack_10b0._4_4_ = (float)((ulong)uStack_4930 >> 0x20);
          uStack_10a8._0_4_ = (float)uStack_4928;
          uStack_10a8._4_4_ = (float)((ulong)uStack_4928 >> 0x20);
          local_4940 = CONCAT44(fStack_109c + local_10c0._4_4_,local_10a0 + (float)local_10c0);
          uStack_4938 = CONCAT44(fStack_1094 + uStack_10b8._4_4_,fStack_1098 + (float)uStack_10b8);
          uStack_4930 = CONCAT44(fStack_108c + uStack_10b0._4_4_,fStack_1090 + (float)uStack_10b0);
          uStack_4928 = CONCAT44(local_1e20 + uStack_10a8._4_4_,fStack_1088 + (float)uStack_10a8);
          local_1540 = local_4960;
          uStack_1538 = uStack_4958;
          uStack_1530 = uStack_4950;
          uStack_1528 = uStack_4948;
          local_1060 = local_1e60 * (float)local_b80;
          fStack_105c = local_1e60 * local_b80._4_4_;
          fStack_1058 = local_1e60 * (float)uStack_b78;
          fStack_1054 = local_1e60 * uStack_b78._4_4_;
          fStack_1050 = local_1e60 * (float)uStack_b70;
          fStack_104c = local_1e60 * uStack_b70._4_4_;
          fStack_1048 = local_1e60 * (float)uStack_b68;
          uVar32 = local_4960;
          uVar33 = uStack_4958;
          uVar34 = uStack_4950;
          uVar35 = uStack_4948;
          local_1080._0_4_ = (float)local_4960;
          local_1080._4_4_ = (float)((ulong)local_4960 >> 0x20);
          uStack_1078._0_4_ = (float)uStack_4958;
          uStack_1078._4_4_ = (float)((ulong)uStack_4958 >> 0x20);
          uStack_1070._0_4_ = (float)uStack_4950;
          uStack_1070._4_4_ = (float)((ulong)uStack_4950 >> 0x20);
          uStack_1068._0_4_ = (float)uStack_4948;
          uStack_1068._4_4_ = (float)((ulong)uStack_4948 >> 0x20);
          local_4960 = CONCAT44(fStack_105c + local_1080._4_4_,local_1060 + (float)local_1080);
          uStack_4958 = CONCAT44(fStack_1054 + uStack_1078._4_4_,fStack_1058 + (float)uStack_1078);
          uStack_4950 = CONCAT44(fStack_104c + uStack_1070._4_4_,fStack_1050 + (float)uStack_1070);
          uStack_4948 = CONCAT44(local_1e60 + uStack_1068._4_4_,fStack_1048 + (float)uStack_1068);
          local_1e68 = local_4848 + 8;
          local_1ea0 = *local_1e68;
          local_1560 = CONCAT44(local_1ea0,local_1ea0);
          uStack_1558 = CONCAT44(local_1ea0,local_1ea0);
          uStack_1550 = CONCAT44(local_1ea0,local_1ea0);
          uStack_1548 = CONCAT44(local_1ea0,local_1ea0);
          local_1ea8 = local_4848 + 9;
          local_1ee0 = *local_1ea8;
          local_15c0 = CONCAT44(local_1ee0,local_1ee0);
          uStack_15b8 = CONCAT44(local_1ee0,local_1ee0);
          uStack_15b0 = CONCAT44(local_1ee0,local_1ee0);
          uStack_15a8 = CONCAT44(local_1ee0,local_1ee0);
          local_15a0 = local_4980;
          uStack_1598 = uStack_4978;
          uStack_1590 = uStack_4970;
          uStack_1588 = uStack_4968;
          local_1020 = local_1ea0 * (float)local_b80;
          fStack_101c = local_1ea0 * local_b80._4_4_;
          fStack_1018 = local_1ea0 * (float)uStack_b78;
          fStack_1014 = local_1ea0 * uStack_b78._4_4_;
          fStack_1010 = local_1ea0 * (float)uStack_b70;
          fStack_100c = local_1ea0 * uStack_b70._4_4_;
          fStack_1008 = local_1ea0 * (float)uStack_b68;
          uVar36 = local_4980;
          uVar37 = uStack_4978;
          uVar38 = uStack_4970;
          uVar39 = uStack_4968;
          local_1040._0_4_ = (float)local_4980;
          local_1040._4_4_ = (float)((ulong)local_4980 >> 0x20);
          uStack_1038._0_4_ = (float)uStack_4978;
          uStack_1038._4_4_ = (float)((ulong)uStack_4978 >> 0x20);
          uStack_1030._0_4_ = (float)uStack_4970;
          uStack_1030._4_4_ = (float)((ulong)uStack_4970 >> 0x20);
          uStack_1028._0_4_ = (float)uStack_4968;
          uStack_1028._4_4_ = (float)((ulong)uStack_4968 >> 0x20);
          local_4980 = CONCAT44(fStack_101c + local_1040._4_4_,local_1020 + (float)local_1040);
          uStack_4978 = CONCAT44(fStack_1014 + uStack_1038._4_4_,fStack_1018 + (float)uStack_1038);
          uStack_4970 = CONCAT44(fStack_100c + uStack_1030._4_4_,fStack_1010 + (float)uStack_1030);
          uStack_4968 = CONCAT44(local_1ea0 + uStack_1028._4_4_,fStack_1008 + (float)uStack_1028);
          local_1600 = local_49a0;
          uStack_15f8 = uStack_4998;
          uStack_15f0 = uStack_4990;
          uStack_15e8 = uStack_4988;
          local_fe0 = local_1ee0 * (float)local_b80;
          fStack_fdc = local_1ee0 * local_b80._4_4_;
          fStack_fd8 = local_1ee0 * (float)uStack_b78;
          fStack_fd4 = local_1ee0 * uStack_b78._4_4_;
          fStack_fd0 = local_1ee0 * (float)uStack_b70;
          fStack_fcc = local_1ee0 * uStack_b70._4_4_;
          fStack_fc8 = local_1ee0 * (float)uStack_b68;
          uVar40 = local_49a0;
          uVar41 = uStack_4998;
          uVar42 = uStack_4990;
          uVar43 = uStack_4988;
          local_1000._0_4_ = (float)local_49a0;
          local_1000._4_4_ = (float)((ulong)local_49a0 >> 0x20);
          uStack_ff8._0_4_ = (float)uStack_4998;
          uStack_ff8._4_4_ = (float)((ulong)uStack_4998 >> 0x20);
          uStack_ff0._0_4_ = (float)uStack_4990;
          uStack_ff0._4_4_ = (float)((ulong)uStack_4990 >> 0x20);
          uStack_fe8._0_4_ = (float)uStack_4988;
          uStack_fe8._4_4_ = (float)((ulong)uStack_4988 >> 0x20);
          local_49a0 = CONCAT44(fStack_fdc + local_1000._4_4_,local_fe0 + (float)local_1000);
          uStack_4998 = CONCAT44(fStack_fd4 + uStack_ff8._4_4_,fStack_fd8 + (float)uStack_ff8);
          uStack_4990 = CONCAT44(fStack_fcc + uStack_ff0._4_4_,fStack_fd0 + (float)uStack_ff0);
          uStack_4988 = CONCAT44(local_1ee0 + uStack_fe8._4_4_,fStack_fc8 + (float)uStack_fe8);
          local_1ee8 = local_4848 + 10;
          local_1f20 = *local_1ee8;
          local_1620 = CONCAT44(local_1f20,local_1f20);
          uStack_1618 = CONCAT44(local_1f20,local_1f20);
          uStack_1610 = CONCAT44(local_1f20,local_1f20);
          uStack_1608 = CONCAT44(local_1f20,local_1f20);
          local_1f28 = local_4848 + 0xb;
          local_1f60 = *local_1f28;
          local_1680 = CONCAT44(local_1f60,local_1f60);
          uStack_1678 = CONCAT44(local_1f60,local_1f60);
          uStack_1670 = CONCAT44(local_1f60,local_1f60);
          uStack_1668 = CONCAT44(local_1f60,local_1f60);
          local_1660 = local_49c0;
          uStack_1658 = uStack_49b8;
          uStack_1650 = uStack_49b0;
          uStack_1648 = uStack_49a8;
          local_fa0 = local_1f20 * (float)local_b80;
          fStack_f9c = local_1f20 * local_b80._4_4_;
          fStack_f98 = local_1f20 * (float)uStack_b78;
          fStack_f94 = local_1f20 * uStack_b78._4_4_;
          fStack_f90 = local_1f20 * (float)uStack_b70;
          fStack_f8c = local_1f20 * uStack_b70._4_4_;
          fStack_f88 = local_1f20 * (float)uStack_b68;
          uVar44 = local_49c0;
          uVar45 = uStack_49b8;
          uVar46 = uStack_49b0;
          uVar47 = uStack_49a8;
          local_fc0._0_4_ = (float)local_49c0;
          local_fc0._4_4_ = (float)((ulong)local_49c0 >> 0x20);
          uStack_fb8._0_4_ = (float)uStack_49b8;
          uStack_fb8._4_4_ = (float)((ulong)uStack_49b8 >> 0x20);
          uStack_fb0._0_4_ = (float)uStack_49b0;
          uStack_fb0._4_4_ = (float)((ulong)uStack_49b0 >> 0x20);
          uStack_fa8._0_4_ = (float)uStack_49a8;
          uStack_fa8._4_4_ = (float)((ulong)uStack_49a8 >> 0x20);
          local_49c0 = CONCAT44(fStack_f9c + local_fc0._4_4_,local_fa0 + (float)local_fc0);
          uStack_49b8 = CONCAT44(fStack_f94 + uStack_fb8._4_4_,fStack_f98 + (float)uStack_fb8);
          uStack_49b0 = CONCAT44(fStack_f8c + uStack_fb0._4_4_,fStack_f90 + (float)uStack_fb0);
          uStack_49a8 = CONCAT44(local_1f20 + uStack_fa8._4_4_,fStack_f88 + (float)uStack_fa8);
          local_16c0 = local_49e0;
          uStack_16b8 = uStack_49d8;
          uStack_16b0 = uStack_49d0;
          uStack_16a8 = uStack_49c8;
          local_f60 = local_1f60 * (float)local_b80;
          fStack_f5c = local_1f60 * local_b80._4_4_;
          fStack_f58 = local_1f60 * (float)uStack_b78;
          fStack_f54 = local_1f60 * uStack_b78._4_4_;
          fStack_f50 = local_1f60 * (float)uStack_b70;
          fStack_f4c = local_1f60 * uStack_b70._4_4_;
          fStack_f48 = local_1f60 * (float)uStack_b68;
          uVar48 = local_49e0;
          uVar49 = uStack_49d8;
          uVar50 = uStack_49d0;
          uVar51 = uStack_49c8;
          local_f80._0_4_ = (float)local_49e0;
          local_f80._4_4_ = (float)((ulong)local_49e0 >> 0x20);
          uStack_f78._0_4_ = (float)uStack_49d8;
          uStack_f78._4_4_ = (float)((ulong)uStack_49d8 >> 0x20);
          uStack_f70._0_4_ = (float)uStack_49d0;
          uStack_f70._4_4_ = (float)((ulong)uStack_49d0 >> 0x20);
          uStack_f68._0_4_ = (float)uStack_49c8;
          uStack_f68._4_4_ = (float)((ulong)uStack_49c8 >> 0x20);
          local_49e0 = CONCAT44(fStack_f5c + local_f80._4_4_,local_f60 + (float)local_f80);
          uStack_49d8 = CONCAT44(fStack_f54 + uStack_f78._4_4_,fStack_f58 + (float)uStack_f78);
          uStack_49d0 = CONCAT44(fStack_f4c + uStack_f70._4_4_,fStack_f50 + (float)uStack_f70);
          uStack_49c8 = CONCAT44(local_1f60 + uStack_f68._4_4_,fStack_f48 + (float)uStack_f68);
          local_4848 = local_4848 + 0xc;
          local_4850 = local_4850 + 4;
          fStack_1f5c = local_1f60;
          fStack_1f58 = local_1f60;
          fStack_1f54 = local_1f60;
          fStack_1f50 = local_1f60;
          fStack_1f4c = local_1f60;
          fStack_1f48 = local_1f60;
          fStack_1f44 = local_1f60;
          local_1f2c = local_1f60;
          fStack_1f1c = local_1f20;
          fStack_1f18 = local_1f20;
          fStack_1f14 = local_1f20;
          fStack_1f10 = local_1f20;
          fStack_1f0c = local_1f20;
          fStack_1f08 = local_1f20;
          fStack_1f04 = local_1f20;
          local_1eec = local_1f20;
          fStack_1edc = local_1ee0;
          fStack_1ed8 = local_1ee0;
          fStack_1ed4 = local_1ee0;
          fStack_1ed0 = local_1ee0;
          fStack_1ecc = local_1ee0;
          fStack_1ec8 = local_1ee0;
          fStack_1ec4 = local_1ee0;
          local_1eac = local_1ee0;
          fStack_1e9c = local_1ea0;
          fStack_1e98 = local_1ea0;
          fStack_1e94 = local_1ea0;
          fStack_1e90 = local_1ea0;
          fStack_1e8c = local_1ea0;
          fStack_1e88 = local_1ea0;
          fStack_1e84 = local_1ea0;
          local_1e6c = local_1ea0;
          fStack_1e5c = local_1e60;
          fStack_1e58 = local_1e60;
          fStack_1e54 = local_1e60;
          fStack_1e50 = local_1e60;
          fStack_1e4c = local_1e60;
          fStack_1e48 = local_1e60;
          fStack_1e44 = local_1e60;
          local_1e2c = local_1e60;
          fStack_1e1c = local_1e20;
          fStack_1e18 = local_1e20;
          fStack_1e14 = local_1e20;
          fStack_1e10 = local_1e20;
          fStack_1e0c = local_1e20;
          fStack_1e08 = local_1e20;
          fStack_1e04 = local_1e20;
          local_1dec = local_1e20;
          fStack_1ddc = local_1de0;
          fStack_1dd8 = local_1de0;
          fStack_1dd4 = local_1de0;
          fStack_1dd0 = local_1de0;
          fStack_1dcc = local_1de0;
          fStack_1dc8 = local_1de0;
          fStack_1dc4 = local_1de0;
          local_1dac = local_1de0;
          fStack_1d9c = local_1da0;
          fStack_1d98 = local_1da0;
          fStack_1d94 = local_1da0;
          fStack_1d90 = local_1da0;
          fStack_1d8c = local_1da0;
          fStack_1d88 = local_1da0;
          fStack_1d84 = local_1da0;
          local_1d6c = local_1da0;
          fStack_1d5c = local_1d60;
          fStack_1d58 = local_1d60;
          fStack_1d54 = local_1d60;
          fStack_1d50 = local_1d60;
          fStack_1d4c = local_1d60;
          fStack_1d48 = local_1d60;
          fStack_1d44 = local_1d60;
          local_1d2c = local_1d60;
          fStack_1d1c = local_1d20;
          fStack_1d18 = local_1d20;
          fStack_1d14 = local_1d20;
          fStack_1d10 = local_1d20;
          fStack_1d0c = local_1d20;
          fStack_1d08 = local_1d20;
          fStack_1d04 = local_1d20;
          local_1cec = local_1d20;
          fStack_1cdc = local_1ce0;
          fStack_1cd8 = local_1ce0;
          fStack_1cd4 = local_1ce0;
          fStack_1cd0 = local_1ce0;
          fStack_1ccc = local_1ce0;
          fStack_1cc8 = local_1ce0;
          fStack_1cc4 = local_1ce0;
          local_1cac = local_1ce0;
          fStack_1c9c = local_1ca0;
          fStack_1c98 = local_1ca0;
          fStack_1c94 = local_1ca0;
          fStack_1c90 = local_1ca0;
          fStack_1c8c = local_1ca0;
          fStack_1c88 = local_1ca0;
          fStack_1c84 = local_1ca0;
          local_1c6c = local_1ca0;
          local_1640 = local_16a0;
          uStack_1638 = uStack_1698;
          uStack_1630 = uStack_1690;
          uStack_1628 = uStack_1688;
          local_15e0 = local_16a0;
          uStack_15d8 = uStack_1698;
          uStack_15d0 = uStack_1690;
          uStack_15c8 = uStack_1688;
          local_1580 = local_16a0;
          uStack_1578 = uStack_1698;
          uStack_1570 = uStack_1690;
          uStack_1568 = uStack_1688;
          local_1520 = local_16a0;
          uStack_1518 = uStack_1698;
          uStack_1510 = uStack_1690;
          uStack_1508 = uStack_1688;
          local_14c0 = local_16a0;
          uStack_14b8 = uStack_1698;
          uStack_14b0 = uStack_1690;
          uStack_14a8 = uStack_1688;
          local_1460 = local_16a0;
          uStack_1458 = uStack_1698;
          uStack_1450 = uStack_1690;
          uStack_1448 = uStack_1688;
          local_1400 = local_16a0;
          uStack_13f8 = uStack_1698;
          uStack_13f0 = uStack_1690;
          uStack_13e8 = uStack_1688;
          local_13a0 = local_16a0;
          uStack_1398 = uStack_1698;
          uStack_1390 = uStack_1690;
          uStack_1388 = uStack_1688;
          local_1340 = local_16a0;
          uStack_1338 = uStack_1698;
          uStack_1330 = uStack_1690;
          uStack_1328 = uStack_1688;
          local_12e0 = local_16a0;
          uStack_12d8 = uStack_1698;
          uStack_12d0 = uStack_1690;
          uStack_12c8 = uStack_1688;
          local_1280 = local_16a0;
          uStack_1278 = uStack_1698;
          uStack_1270 = uStack_1690;
          uStack_1268 = uStack_1688;
          local_1240 = uVar4;
          uStack_1238 = uVar5;
          uStack_1230 = uVar6;
          uStack_1228 = uVar7;
          fStack_1204 = local_1ca0;
          local_1200 = uVar8;
          uStack_11f8 = uVar9;
          uStack_11f0 = uVar10;
          uStack_11e8 = uVar11;
          fStack_11c4 = local_1ce0;
          local_11c0 = uVar12;
          uStack_11b8 = uVar13;
          uStack_11b0 = uVar14;
          uStack_11a8 = uVar15;
          fStack_1184 = local_1d20;
          local_1180 = uVar16;
          uStack_1178 = uVar17;
          uStack_1170 = uVar18;
          uStack_1168 = uVar19;
          fStack_1144 = local_1d60;
          local_1140 = uVar20;
          uStack_1138 = uVar21;
          uStack_1130 = uVar22;
          uStack_1128 = uVar23;
          fStack_1104 = local_1da0;
          local_1100 = uVar24;
          uStack_10f8 = uVar25;
          uStack_10f0 = uVar26;
          uStack_10e8 = uVar27;
          fStack_10c4 = local_1de0;
          local_10c0 = uVar28;
          uStack_10b8 = uVar29;
          uStack_10b0 = uVar30;
          uStack_10a8 = uVar31;
          fStack_1084 = local_1e20;
          local_1080 = uVar32;
          uStack_1078 = uVar33;
          uStack_1070 = uVar34;
          uStack_1068 = uVar35;
          fStack_1044 = local_1e60;
          local_1040 = uVar36;
          uStack_1038 = uVar37;
          uStack_1030 = uVar38;
          uStack_1028 = uVar39;
          fStack_1004 = local_1ea0;
          local_1000 = uVar40;
          uStack_ff8 = uVar41;
          uStack_ff0 = uVar42;
          uStack_fe8 = uVar43;
          fStack_fc4 = local_1ee0;
          local_fc0 = uVar44;
          uStack_fb8 = uVar45;
          uStack_fb0 = uVar46;
          uStack_fa8 = uVar47;
          fStack_f84 = local_1f20;
          local_f80 = uVar48;
          uStack_f78 = uVar49;
          uStack_f70 = uVar50;
          uStack_f68 = uVar51;
          fStack_f44 = local_1f60;
          local_b80 = local_16a0;
          uStack_b78 = uStack_1698;
          uStack_b70 = uStack_1690;
          uStack_b68 = uStack_1688;
          local_b60 = local_1ca0;
          fStack_b5c = local_1ca0;
          fStack_b58 = local_1ca0;
          fStack_b54 = local_1ca0;
          fStack_b50 = local_1ca0;
          fStack_b4c = local_1ca0;
          fStack_b48 = local_1ca0;
          fStack_b44 = local_1ca0;
          local_b40 = local_16a0;
          uStack_b38 = uStack_1698;
          uStack_b30 = uStack_1690;
          uStack_b28 = uStack_1688;
          local_b20 = local_1ce0;
          fStack_b1c = local_1ce0;
          fStack_b18 = local_1ce0;
          fStack_b14 = local_1ce0;
          fStack_b10 = local_1ce0;
          fStack_b0c = local_1ce0;
          fStack_b08 = local_1ce0;
          fStack_b04 = local_1ce0;
          local_b00 = local_16a0;
          uStack_af8 = uStack_1698;
          uStack_af0 = uStack_1690;
          uStack_ae8 = uStack_1688;
          local_ae0 = local_1d20;
          fStack_adc = local_1d20;
          fStack_ad8 = local_1d20;
          fStack_ad4 = local_1d20;
          fStack_ad0 = local_1d20;
          fStack_acc = local_1d20;
          fStack_ac8 = local_1d20;
          fStack_ac4 = local_1d20;
          local_ac0 = local_16a0;
          uStack_ab8 = uStack_1698;
          uStack_ab0 = uStack_1690;
          uStack_aa8 = uStack_1688;
          local_aa0 = local_1d60;
          fStack_a9c = local_1d60;
          fStack_a98 = local_1d60;
          fStack_a94 = local_1d60;
          fStack_a90 = local_1d60;
          fStack_a8c = local_1d60;
          fStack_a88 = local_1d60;
          fStack_a84 = local_1d60;
          local_a80 = local_16a0;
          uStack_a78 = uStack_1698;
          uStack_a70 = uStack_1690;
          uStack_a68 = uStack_1688;
          local_a60 = local_1da0;
          fStack_a5c = local_1da0;
          fStack_a58 = local_1da0;
          fStack_a54 = local_1da0;
          fStack_a50 = local_1da0;
          fStack_a4c = local_1da0;
          fStack_a48 = local_1da0;
          fStack_a44 = local_1da0;
          local_a40 = local_16a0;
          uStack_a38 = uStack_1698;
          uStack_a30 = uStack_1690;
          uStack_a28 = uStack_1688;
          local_a20 = local_1de0;
          fStack_a1c = local_1de0;
          fStack_a18 = local_1de0;
          fStack_a14 = local_1de0;
          fStack_a10 = local_1de0;
          fStack_a0c = local_1de0;
          fStack_a08 = local_1de0;
          fStack_a04 = local_1de0;
          local_a00 = local_16a0;
          uStack_9f8 = uStack_1698;
          uStack_9f0 = uStack_1690;
          uStack_9e8 = uStack_1688;
          local_9e0 = local_1e20;
          fStack_9dc = local_1e20;
          fStack_9d8 = local_1e20;
          fStack_9d4 = local_1e20;
          fStack_9d0 = local_1e20;
          fStack_9cc = local_1e20;
          fStack_9c8 = local_1e20;
          fStack_9c4 = local_1e20;
          local_9c0 = local_16a0;
          uStack_9b8 = uStack_1698;
          uStack_9b0 = uStack_1690;
          uStack_9a8 = uStack_1688;
          local_9a0 = local_1e60;
          fStack_99c = local_1e60;
          fStack_998 = local_1e60;
          fStack_994 = local_1e60;
          fStack_990 = local_1e60;
          fStack_98c = local_1e60;
          fStack_988 = local_1e60;
          fStack_984 = local_1e60;
          local_980 = local_16a0;
          uStack_978 = uStack_1698;
          uStack_970 = uStack_1690;
          uStack_968 = uStack_1688;
          local_960 = local_1ea0;
          fStack_95c = local_1ea0;
          fStack_958 = local_1ea0;
          fStack_954 = local_1ea0;
          fStack_950 = local_1ea0;
          fStack_94c = local_1ea0;
          fStack_948 = local_1ea0;
          fStack_944 = local_1ea0;
          local_940 = local_16a0;
          uStack_938 = uStack_1698;
          uStack_930 = uStack_1690;
          uStack_928 = uStack_1688;
          local_920 = local_1ee0;
          fStack_91c = local_1ee0;
          fStack_918 = local_1ee0;
          fStack_914 = local_1ee0;
          fStack_910 = local_1ee0;
          fStack_90c = local_1ee0;
          fStack_908 = local_1ee0;
          fStack_904 = local_1ee0;
          local_900 = local_16a0;
          uStack_8f8 = uStack_1698;
          uStack_8f0 = uStack_1690;
          uStack_8e8 = uStack_1688;
          local_8e0 = local_1f20;
          fStack_8dc = local_1f20;
          fStack_8d8 = local_1f20;
          fStack_8d4 = local_1f20;
          fStack_8d0 = local_1f20;
          fStack_8cc = local_1f20;
          fStack_8c8 = local_1f20;
          fStack_8c4 = local_1f20;
          local_8c0 = local_16a0;
          uStack_8b8 = uStack_1698;
          uStack_8b0 = uStack_1690;
          uStack_8a8 = uStack_1688;
          local_8a0 = local_1f60;
          fStack_89c = local_1f60;
          fStack_898 = local_1f60;
          fStack_894 = local_1f60;
          fStack_890 = local_1f60;
          fStack_88c = local_1f60;
          fStack_888 = local_1f60;
          fStack_884 = local_1f60;
        }
        local_29e8 = local_4758;
        local_2a20 = local_4880;
        uStack_2a18 = uStack_4878;
        uStack_2a10 = uStack_4870;
        uStack_2a08 = uStack_4868;
        *(undefined8 *)*local_4758 = local_4880;
        *(undefined8 *)(*local_4758 + 8) = uStack_4878;
        *(undefined8 *)(*local_4758 + 0x10) = uStack_4870;
        *(undefined8 *)(*local_4758 + 0x18) = uStack_4868;
        local_2a28 = local_4758 + 1;
        local_2a60 = local_48a0;
        uStack_2a58 = uStack_4898;
        uStack_2a50 = uStack_4890;
        uStack_2a48 = uStack_4888;
        *(undefined8 *)*local_2a28 = local_48a0;
        *(undefined8 *)(local_4758[1] + 8) = uStack_4898;
        *(undefined8 *)(local_4758[1] + 0x10) = uStack_4890;
        *(undefined8 *)(local_4758[1] + 0x18) = uStack_4888;
        local_2a68 = local_4758 + 2;
        local_2aa0 = local_48c0;
        uStack_2a98 = uStack_48b8;
        uStack_2a90 = uStack_48b0;
        uStack_2a88 = uStack_48a8;
        *(undefined8 *)*local_2a68 = local_48c0;
        *(undefined8 *)(local_4758[2] + 8) = uStack_48b8;
        *(undefined8 *)(local_4758[2] + 0x10) = uStack_48b0;
        *(undefined8 *)(local_4758[2] + 0x18) = uStack_48a8;
        local_2aa8 = local_4758 + 3;
        local_2ae0 = local_48e0;
        uStack_2ad8 = uStack_48d8;
        uStack_2ad0 = uStack_48d0;
        uStack_2ac8 = uStack_48c8;
        *(undefined8 *)*local_2aa8 = local_48e0;
        *(undefined8 *)(local_4758[3] + 8) = uStack_48d8;
        *(undefined8 *)(local_4758[3] + 0x10) = uStack_48d0;
        *(undefined8 *)(local_4758[3] + 0x18) = uStack_48c8;
        local_2ae8 = local_4758 + 4;
        local_2b20 = local_4900;
        uStack_2b18 = uStack_48f8;
        uStack_2b10 = uStack_48f0;
        uStack_2b08 = uStack_48e8;
        *(undefined8 *)*local_2ae8 = local_4900;
        *(undefined8 *)(local_4758[4] + 8) = uStack_48f8;
        *(undefined8 *)(local_4758[4] + 0x10) = uStack_48f0;
        *(undefined8 *)(local_4758[4] + 0x18) = uStack_48e8;
        local_2b28 = local_4758 + 5;
        local_2b60 = local_4920;
        uStack_2b58 = uStack_4918;
        uStack_2b50 = uStack_4910;
        uStack_2b48 = uStack_4908;
        *(undefined8 *)*local_2b28 = local_4920;
        *(undefined8 *)(local_4758[5] + 8) = uStack_4918;
        *(undefined8 *)(local_4758[5] + 0x10) = uStack_4910;
        *(undefined8 *)(local_4758[5] + 0x18) = uStack_4908;
        local_2b68 = local_4758 + 6;
        local_2ba0 = local_4940;
        uStack_2b98 = uStack_4938;
        uStack_2b90 = uStack_4930;
        uStack_2b88 = uStack_4928;
        *(undefined8 *)*local_2b68 = local_4940;
        *(undefined8 *)(local_4758[6] + 8) = uStack_4938;
        *(undefined8 *)(local_4758[6] + 0x10) = uStack_4930;
        *(undefined8 *)(local_4758[6] + 0x18) = uStack_4928;
        local_2ba8 = local_4758 + 7;
        local_2be0 = local_4960;
        uStack_2bd8 = uStack_4958;
        uStack_2bd0 = uStack_4950;
        uStack_2bc8 = uStack_4948;
        *(undefined8 *)*local_2ba8 = local_4960;
        *(undefined8 *)(local_4758[7] + 8) = uStack_4958;
        *(undefined8 *)(local_4758[7] + 0x10) = uStack_4950;
        *(undefined8 *)(local_4758[7] + 0x18) = uStack_4948;
        local_2be8 = local_4758 + 8;
        local_2c20 = local_4980;
        uStack_2c18 = uStack_4978;
        uStack_2c10 = uStack_4970;
        uStack_2c08 = uStack_4968;
        *(undefined8 *)*local_2be8 = local_4980;
        *(undefined8 *)(local_4758[8] + 8) = uStack_4978;
        *(undefined8 *)(local_4758[8] + 0x10) = uStack_4970;
        *(undefined8 *)(local_4758[8] + 0x18) = uStack_4968;
        local_2c28 = local_4758 + 9;
        local_2c60 = local_49a0;
        uStack_2c58 = uStack_4998;
        uStack_2c50 = uStack_4990;
        uStack_2c48 = uStack_4988;
        *(undefined8 *)*local_2c28 = local_49a0;
        *(undefined8 *)(local_4758[9] + 8) = uStack_4998;
        *(undefined8 *)(local_4758[9] + 0x10) = uStack_4990;
        *(undefined8 *)(local_4758[9] + 0x18) = uStack_4988;
        local_2c68 = local_4758 + 10;
        local_2ca0 = local_49c0;
        uStack_2c98 = uStack_49b8;
        uStack_2c90 = uStack_49b0;
        uStack_2c88 = uStack_49a8;
        *(undefined8 *)*local_2c68 = local_49c0;
        *(undefined8 *)(local_4758[10] + 8) = uStack_49b8;
        *(undefined8 *)(local_4758[10] + 0x10) = uStack_49b0;
        *(undefined8 *)(local_4758[10] + 0x18) = uStack_49a8;
        local_2ca8 = local_4758 + 0xb;
        local_2ce0 = local_49e0;
        uStack_2cd8 = uStack_49d8;
        uStack_2cd0 = uStack_49d0;
        uStack_2cc8 = uStack_49c8;
        auVar56._8_8_ = uStack_49d8;
        auVar56._0_8_ = local_49e0;
        auVar56._16_8_ = uStack_49d0;
        auVar56._24_8_ = uStack_49c8;
        *local_2ca8 = auVar56;
        local_4758 = local_4758 + 0xc;
        local_2e0 = ZEXT832(0) << 0x20;
        local_2c0 = ZEXT832(0) << 0x20;
        local_2a0 = ZEXT832(0) << 0x20;
        local_280 = ZEXT832(0) << 0x20;
        local_260 = ZEXT832(0) << 0x20;
        local_240 = ZEXT832(0) << 0x20;
        local_220 = ZEXT832(0) << 0x20;
        local_200 = ZEXT832(0) << 0x20;
        local_1e0 = ZEXT832(0) << 0x20;
        local_1c0 = ZEXT832(0) << 0x20;
        local_1a0 = ZEXT832(0) << 0x20;
      }
      for (; local_483c + 7 < local_3c14; local_483c = local_483c + 8) {
        local_397c = local_483c / 0xc +
                     (int)((long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_483c % 0xc & 0xffffffffU) / 8);
        local_3978 = &local_4838;
        local_4ba8 = (float *)((long)local_90 + (long)local_3c3c * (long)local_397c * local_3c58);
        local_398c = local_47ec;
        local_3988 = &local_47e8;
        local_4bb0 = (undefined8 *)(local_138 + (long)local_124 * (long)local_47ec * local_140);
        local_300 = 0;
        uStack_2f8 = 0;
        uStack_2f0 = 0;
        uStack_2e8 = 0;
        local_4be0 = 0;
        uStack_4bd8 = 0;
        uStack_4bd0 = 0;
        uStack_4bc8 = 0;
        local_320._8_8_ = SUB328(ZEXT832(0),4);
        local_4c00 = 0;
        uStack_4bf8 = local_320._8_8_;
        uStack_4bf0 = 0;
        uStack_4be8 = 0;
        local_340._8_8_ = SUB328(ZEXT832(0),4);
        local_4c20 = 0;
        uStack_4c18 = local_340._8_8_;
        uStack_4c10 = 0;
        uStack_4c08 = 0;
        local_360._8_8_ = SUB328(ZEXT832(0),4);
        local_4c40 = 0;
        uStack_4c38 = local_360._8_8_;
        uStack_4c30 = 0;
        uStack_4c28 = 0;
        local_380._8_8_ = SUB328(ZEXT832(0),4);
        local_4c60 = 0;
        uStack_4c58 = local_380._8_8_;
        uStack_4c50 = 0;
        uStack_4c48 = 0;
        local_3a0._8_8_ = SUB328(ZEXT832(0),4);
        local_4c80 = 0;
        uStack_4c78 = local_3a0._8_8_;
        uStack_4c70 = 0;
        uStack_4c68 = 0;
        local_3c0._8_8_ = SUB328(ZEXT832(0),4);
        local_4ca0 = 0;
        uStack_4c98 = local_3c0._8_8_;
        uStack_4c90 = 0;
        uStack_4c88 = 0;
        local_3e0._8_8_ = SUB328(ZEXT832(0),4);
        local_4cc0 = 0;
        uStack_4cb8 = local_3e0._8_8_;
        uStack_4cb0 = 0;
        uStack_4ca8 = 0;
        for (local_4cc4 = 0; local_4cc4 < local_3c1c << 3; local_4cc4 = local_4cc4 + 1) {
          local_3808 = local_4bb0;
          local_19a0 = *local_4bb0;
          uStack_1998 = local_4bb0[1];
          uStack_1990 = local_4bb0[2];
          uStack_1988 = local_4bb0[3];
          local_1f68 = local_4ba8;
          local_1fa0 = *local_4ba8;
          local_16e0 = CONCAT44(local_1fa0,local_1fa0);
          uStack_16d8 = CONCAT44(local_1fa0,local_1fa0);
          uStack_16d0 = CONCAT44(local_1fa0,local_1fa0);
          uStack_16c8 = CONCAT44(local_1fa0,local_1fa0);
          local_1fa8 = local_4ba8 + 1;
          local_1fe0 = *local_1fa8;
          local_1740 = CONCAT44(local_1fe0,local_1fe0);
          uStack_1738 = CONCAT44(local_1fe0,local_1fe0);
          uStack_1730 = CONCAT44(local_1fe0,local_1fe0);
          uStack_1728 = CONCAT44(local_1fe0,local_1fe0);
          local_1720 = local_4be0;
          uStack_1718 = uStack_4bd8;
          uStack_1710 = uStack_4bd0;
          uStack_1708 = uStack_4bc8;
          local_880._0_4_ = (float)local_19a0;
          local_880._4_4_ = (float)((ulong)local_19a0 >> 0x20);
          uStack_878._0_4_ = (float)uStack_1998;
          uStack_878._4_4_ = (float)((ulong)uStack_1998 >> 0x20);
          uStack_870._0_4_ = (float)uStack_1990;
          uStack_870._4_4_ = (float)((ulong)uStack_1990 >> 0x20);
          uStack_868._0_4_ = (float)uStack_1988;
          local_f20 = local_1fa0 * (float)local_880;
          fStack_f1c = local_1fa0 * local_880._4_4_;
          fStack_f18 = local_1fa0 * (float)uStack_878;
          fStack_f14 = local_1fa0 * uStack_878._4_4_;
          fStack_f10 = local_1fa0 * (float)uStack_870;
          fStack_f0c = local_1fa0 * uStack_870._4_4_;
          fStack_f08 = local_1fa0 * (float)uStack_868;
          uVar4 = local_4be0;
          uVar5 = uStack_4bd8;
          uVar6 = uStack_4bd0;
          uVar7 = uStack_4bc8;
          local_f40._0_4_ = (float)local_4be0;
          local_f40._4_4_ = (float)((ulong)local_4be0 >> 0x20);
          uStack_f38._0_4_ = (float)uStack_4bd8;
          uStack_f38._4_4_ = (float)((ulong)uStack_4bd8 >> 0x20);
          uStack_f30._0_4_ = (float)uStack_4bd0;
          uStack_f30._4_4_ = (float)((ulong)uStack_4bd0 >> 0x20);
          uStack_f28._0_4_ = (float)uStack_4bc8;
          uStack_f28._4_4_ = (float)((ulong)uStack_4bc8 >> 0x20);
          local_4be0 = CONCAT44(fStack_f1c + local_f40._4_4_,local_f20 + (float)local_f40);
          uStack_4bd8 = CONCAT44(fStack_f14 + uStack_f38._4_4_,fStack_f18 + (float)uStack_f38);
          uStack_4bd0 = CONCAT44(fStack_f0c + uStack_f30._4_4_,fStack_f10 + (float)uStack_f30);
          uStack_4bc8 = CONCAT44(local_1fa0 + uStack_f28._4_4_,fStack_f08 + (float)uStack_f28);
          local_1780 = local_4c00;
          uStack_1778 = uStack_4bf8;
          uStack_1770 = uStack_4bf0;
          uStack_1768 = uStack_4be8;
          local_ee0 = local_1fe0 * (float)local_880;
          fStack_edc = local_1fe0 * local_880._4_4_;
          fStack_ed8 = local_1fe0 * (float)uStack_878;
          fStack_ed4 = local_1fe0 * uStack_878._4_4_;
          fStack_ed0 = local_1fe0 * (float)uStack_870;
          fStack_ecc = local_1fe0 * uStack_870._4_4_;
          fStack_ec8 = local_1fe0 * (float)uStack_868;
          uVar8 = local_4c00;
          uVar9 = uStack_4bf8;
          uVar10 = uStack_4bf0;
          uVar11 = uStack_4be8;
          local_f00._0_4_ = (float)local_4c00;
          local_f00._4_4_ = (float)((ulong)local_4c00 >> 0x20);
          uStack_ef8._0_4_ = (float)uStack_4bf8;
          uStack_ef8._4_4_ = (float)((ulong)uStack_4bf8 >> 0x20);
          uStack_ef0._0_4_ = (float)uStack_4bf0;
          uStack_ef0._4_4_ = (float)((ulong)uStack_4bf0 >> 0x20);
          uStack_ee8._0_4_ = (float)uStack_4be8;
          uStack_ee8._4_4_ = (float)((ulong)uStack_4be8 >> 0x20);
          local_4c00 = CONCAT44(fStack_edc + local_f00._4_4_,local_ee0 + (float)local_f00);
          uStack_4bf8 = CONCAT44(fStack_ed4 + uStack_ef8._4_4_,fStack_ed8 + (float)uStack_ef8);
          uStack_4bf0 = CONCAT44(fStack_ecc + uStack_ef0._4_4_,fStack_ed0 + (float)uStack_ef0);
          uStack_4be8 = CONCAT44(local_1fe0 + uStack_ee8._4_4_,fStack_ec8 + (float)uStack_ee8);
          local_1fe8 = local_4ba8 + 2;
          local_2020 = *local_1fe8;
          local_17a0 = CONCAT44(local_2020,local_2020);
          uStack_1798 = CONCAT44(local_2020,local_2020);
          uStack_1790 = CONCAT44(local_2020,local_2020);
          uStack_1788 = CONCAT44(local_2020,local_2020);
          local_2028 = local_4ba8 + 3;
          local_2060 = *local_2028;
          local_1800 = CONCAT44(local_2060,local_2060);
          uStack_17f8 = CONCAT44(local_2060,local_2060);
          uStack_17f0 = CONCAT44(local_2060,local_2060);
          uStack_17e8 = CONCAT44(local_2060,local_2060);
          local_17e0 = local_4c20;
          uStack_17d8 = uStack_4c18;
          uStack_17d0 = uStack_4c10;
          uStack_17c8 = uStack_4c08;
          local_ea0 = local_2020 * (float)local_880;
          fStack_e9c = local_2020 * local_880._4_4_;
          fStack_e98 = local_2020 * (float)uStack_878;
          fStack_e94 = local_2020 * uStack_878._4_4_;
          fStack_e90 = local_2020 * (float)uStack_870;
          fStack_e8c = local_2020 * uStack_870._4_4_;
          fStack_e88 = local_2020 * (float)uStack_868;
          uVar12 = local_4c20;
          uVar13 = uStack_4c18;
          uVar14 = uStack_4c10;
          uVar15 = uStack_4c08;
          local_ec0._0_4_ = (float)local_4c20;
          local_ec0._4_4_ = (float)((ulong)local_4c20 >> 0x20);
          uStack_eb8._0_4_ = (float)uStack_4c18;
          uStack_eb8._4_4_ = (float)((ulong)uStack_4c18 >> 0x20);
          uStack_eb0._0_4_ = (float)uStack_4c10;
          uStack_eb0._4_4_ = (float)((ulong)uStack_4c10 >> 0x20);
          uStack_ea8._0_4_ = (float)uStack_4c08;
          uStack_ea8._4_4_ = (float)((ulong)uStack_4c08 >> 0x20);
          local_4c20 = CONCAT44(fStack_e9c + local_ec0._4_4_,local_ea0 + (float)local_ec0);
          uStack_4c18 = CONCAT44(fStack_e94 + uStack_eb8._4_4_,fStack_e98 + (float)uStack_eb8);
          uStack_4c10 = CONCAT44(fStack_e8c + uStack_eb0._4_4_,fStack_e90 + (float)uStack_eb0);
          uStack_4c08 = CONCAT44(local_2020 + uStack_ea8._4_4_,fStack_e88 + (float)uStack_ea8);
          local_1840 = local_4c40;
          uStack_1838 = uStack_4c38;
          uStack_1830 = uStack_4c30;
          uStack_1828 = uStack_4c28;
          local_e60 = local_2060 * (float)local_880;
          fStack_e5c = local_2060 * local_880._4_4_;
          fStack_e58 = local_2060 * (float)uStack_878;
          fStack_e54 = local_2060 * uStack_878._4_4_;
          fStack_e50 = local_2060 * (float)uStack_870;
          fStack_e4c = local_2060 * uStack_870._4_4_;
          fStack_e48 = local_2060 * (float)uStack_868;
          uVar16 = local_4c40;
          uVar17 = uStack_4c38;
          uVar18 = uStack_4c30;
          uVar19 = uStack_4c28;
          local_e80._0_4_ = (float)local_4c40;
          local_e80._4_4_ = (float)((ulong)local_4c40 >> 0x20);
          uStack_e78._0_4_ = (float)uStack_4c38;
          uStack_e78._4_4_ = (float)((ulong)uStack_4c38 >> 0x20);
          uStack_e70._0_4_ = (float)uStack_4c30;
          uStack_e70._4_4_ = (float)((ulong)uStack_4c30 >> 0x20);
          uStack_e68._0_4_ = (float)uStack_4c28;
          uStack_e68._4_4_ = (float)((ulong)uStack_4c28 >> 0x20);
          local_4c40 = CONCAT44(fStack_e5c + local_e80._4_4_,local_e60 + (float)local_e80);
          uStack_4c38 = CONCAT44(fStack_e54 + uStack_e78._4_4_,fStack_e58 + (float)uStack_e78);
          uStack_4c30 = CONCAT44(fStack_e4c + uStack_e70._4_4_,fStack_e50 + (float)uStack_e70);
          uStack_4c28 = CONCAT44(local_2060 + uStack_e68._4_4_,fStack_e48 + (float)uStack_e68);
          local_2068 = local_4ba8 + 4;
          local_20a0 = *local_2068;
          local_1860 = CONCAT44(local_20a0,local_20a0);
          uStack_1858 = CONCAT44(local_20a0,local_20a0);
          uStack_1850 = CONCAT44(local_20a0,local_20a0);
          uStack_1848 = CONCAT44(local_20a0,local_20a0);
          local_20a8 = local_4ba8 + 5;
          local_20e0 = *local_20a8;
          local_18c0 = CONCAT44(local_20e0,local_20e0);
          uStack_18b8 = CONCAT44(local_20e0,local_20e0);
          uStack_18b0 = CONCAT44(local_20e0,local_20e0);
          uStack_18a8 = CONCAT44(local_20e0,local_20e0);
          local_18a0 = local_4c60;
          uStack_1898 = uStack_4c58;
          uStack_1890 = uStack_4c50;
          uStack_1888 = uStack_4c48;
          local_e20 = local_20a0 * (float)local_880;
          fStack_e1c = local_20a0 * local_880._4_4_;
          fStack_e18 = local_20a0 * (float)uStack_878;
          fStack_e14 = local_20a0 * uStack_878._4_4_;
          fStack_e10 = local_20a0 * (float)uStack_870;
          fStack_e0c = local_20a0 * uStack_870._4_4_;
          fStack_e08 = local_20a0 * (float)uStack_868;
          uVar20 = local_4c60;
          uVar21 = uStack_4c58;
          uVar22 = uStack_4c50;
          uVar23 = uStack_4c48;
          local_e40._0_4_ = (float)local_4c60;
          local_e40._4_4_ = (float)((ulong)local_4c60 >> 0x20);
          uStack_e38._0_4_ = (float)uStack_4c58;
          uStack_e38._4_4_ = (float)((ulong)uStack_4c58 >> 0x20);
          uStack_e30._0_4_ = (float)uStack_4c50;
          uStack_e30._4_4_ = (float)((ulong)uStack_4c50 >> 0x20);
          uStack_e28._0_4_ = (float)uStack_4c48;
          uStack_e28._4_4_ = (float)((ulong)uStack_4c48 >> 0x20);
          local_4c60 = CONCAT44(fStack_e1c + local_e40._4_4_,local_e20 + (float)local_e40);
          uStack_4c58 = CONCAT44(fStack_e14 + uStack_e38._4_4_,fStack_e18 + (float)uStack_e38);
          uStack_4c50 = CONCAT44(fStack_e0c + uStack_e30._4_4_,fStack_e10 + (float)uStack_e30);
          uStack_4c48 = CONCAT44(local_20a0 + uStack_e28._4_4_,fStack_e08 + (float)uStack_e28);
          local_1900 = local_4c80;
          uStack_18f8 = uStack_4c78;
          uStack_18f0 = uStack_4c70;
          uStack_18e8 = uStack_4c68;
          local_de0 = local_20e0 * (float)local_880;
          fStack_ddc = local_20e0 * local_880._4_4_;
          fStack_dd8 = local_20e0 * (float)uStack_878;
          fStack_dd4 = local_20e0 * uStack_878._4_4_;
          fStack_dd0 = local_20e0 * (float)uStack_870;
          fStack_dcc = local_20e0 * uStack_870._4_4_;
          fStack_dc8 = local_20e0 * (float)uStack_868;
          uVar24 = local_4c80;
          uVar25 = uStack_4c78;
          uVar26 = uStack_4c70;
          uVar27 = uStack_4c68;
          local_e00._0_4_ = (float)local_4c80;
          local_e00._4_4_ = (float)((ulong)local_4c80 >> 0x20);
          uStack_df8._0_4_ = (float)uStack_4c78;
          uStack_df8._4_4_ = (float)((ulong)uStack_4c78 >> 0x20);
          uStack_df0._0_4_ = (float)uStack_4c70;
          uStack_df0._4_4_ = (float)((ulong)uStack_4c70 >> 0x20);
          uStack_de8._0_4_ = (float)uStack_4c68;
          uStack_de8._4_4_ = (float)((ulong)uStack_4c68 >> 0x20);
          local_4c80 = CONCAT44(fStack_ddc + local_e00._4_4_,local_de0 + (float)local_e00);
          uStack_4c78 = CONCAT44(fStack_dd4 + uStack_df8._4_4_,fStack_dd8 + (float)uStack_df8);
          uStack_4c70 = CONCAT44(fStack_dcc + uStack_df0._4_4_,fStack_dd0 + (float)uStack_df0);
          uStack_4c68 = CONCAT44(local_20e0 + uStack_de8._4_4_,fStack_dc8 + (float)uStack_de8);
          local_20e8 = local_4ba8 + 6;
          local_2120 = *local_20e8;
          local_1920 = CONCAT44(local_2120,local_2120);
          uStack_1918 = CONCAT44(local_2120,local_2120);
          uStack_1910 = CONCAT44(local_2120,local_2120);
          uStack_1908 = CONCAT44(local_2120,local_2120);
          local_2128 = local_4ba8 + 7;
          local_2160 = *local_2128;
          local_1980 = CONCAT44(local_2160,local_2160);
          uStack_1978 = CONCAT44(local_2160,local_2160);
          uStack_1970 = CONCAT44(local_2160,local_2160);
          uStack_1968 = CONCAT44(local_2160,local_2160);
          local_1960 = local_4ca0;
          uStack_1958 = uStack_4c98;
          uStack_1950 = uStack_4c90;
          uStack_1948 = uStack_4c88;
          local_da0 = local_2120 * (float)local_880;
          fStack_d9c = local_2120 * local_880._4_4_;
          fStack_d98 = local_2120 * (float)uStack_878;
          fStack_d94 = local_2120 * uStack_878._4_4_;
          fStack_d90 = local_2120 * (float)uStack_870;
          fStack_d8c = local_2120 * uStack_870._4_4_;
          fStack_d88 = local_2120 * (float)uStack_868;
          uVar28 = local_4ca0;
          uVar29 = uStack_4c98;
          uVar30 = uStack_4c90;
          uVar31 = uStack_4c88;
          local_dc0._0_4_ = (float)local_4ca0;
          local_dc0._4_4_ = (float)((ulong)local_4ca0 >> 0x20);
          uStack_db8._0_4_ = (float)uStack_4c98;
          uStack_db8._4_4_ = (float)((ulong)uStack_4c98 >> 0x20);
          uStack_db0._0_4_ = (float)uStack_4c90;
          uStack_db0._4_4_ = (float)((ulong)uStack_4c90 >> 0x20);
          uStack_da8._0_4_ = (float)uStack_4c88;
          uStack_da8._4_4_ = (float)((ulong)uStack_4c88 >> 0x20);
          local_4ca0 = CONCAT44(fStack_d9c + local_dc0._4_4_,local_da0 + (float)local_dc0);
          uStack_4c98 = CONCAT44(fStack_d94 + uStack_db8._4_4_,fStack_d98 + (float)uStack_db8);
          uStack_4c90 = CONCAT44(fStack_d8c + uStack_db0._4_4_,fStack_d90 + (float)uStack_db0);
          uStack_4c88 = CONCAT44(local_2120 + uStack_da8._4_4_,fStack_d88 + (float)uStack_da8);
          local_19c0 = local_4cc0;
          uStack_19b8 = uStack_4cb8;
          uStack_19b0 = uStack_4cb0;
          uStack_19a8 = uStack_4ca8;
          local_d60 = local_2160 * (float)local_880;
          fStack_d5c = local_2160 * local_880._4_4_;
          fStack_d58 = local_2160 * (float)uStack_878;
          fStack_d54 = local_2160 * uStack_878._4_4_;
          fStack_d50 = local_2160 * (float)uStack_870;
          fStack_d4c = local_2160 * uStack_870._4_4_;
          fStack_d48 = local_2160 * (float)uStack_868;
          uVar32 = local_4cc0;
          uVar33 = uStack_4cb8;
          uVar34 = uStack_4cb0;
          uVar35 = uStack_4ca8;
          local_d80._0_4_ = (float)local_4cc0;
          local_d80._4_4_ = (float)((ulong)local_4cc0 >> 0x20);
          uStack_d78._0_4_ = (float)uStack_4cb8;
          uStack_d78._4_4_ = (float)((ulong)uStack_4cb8 >> 0x20);
          uStack_d70._0_4_ = (float)uStack_4cb0;
          uStack_d70._4_4_ = (float)((ulong)uStack_4cb0 >> 0x20);
          uStack_d68._0_4_ = (float)uStack_4ca8;
          uStack_d68._4_4_ = (float)((ulong)uStack_4ca8 >> 0x20);
          local_4cc0 = CONCAT44(fStack_d5c + local_d80._4_4_,local_d60 + (float)local_d80);
          uStack_4cb8 = CONCAT44(fStack_d54 + uStack_d78._4_4_,fStack_d58 + (float)uStack_d78);
          uStack_4cb0 = CONCAT44(fStack_d4c + uStack_d70._4_4_,fStack_d50 + (float)uStack_d70);
          uStack_4ca8 = CONCAT44(local_2160 + uStack_d68._4_4_,fStack_d48 + (float)uStack_d68);
          local_4ba8 = local_4ba8 + 8;
          local_4bb0 = local_4bb0 + 4;
          fStack_215c = local_2160;
          fStack_2158 = local_2160;
          fStack_2154 = local_2160;
          fStack_2150 = local_2160;
          fStack_214c = local_2160;
          fStack_2148 = local_2160;
          fStack_2144 = local_2160;
          local_212c = local_2160;
          fStack_211c = local_2120;
          fStack_2118 = local_2120;
          fStack_2114 = local_2120;
          fStack_2110 = local_2120;
          fStack_210c = local_2120;
          fStack_2108 = local_2120;
          fStack_2104 = local_2120;
          local_20ec = local_2120;
          fStack_20dc = local_20e0;
          fStack_20d8 = local_20e0;
          fStack_20d4 = local_20e0;
          fStack_20d0 = local_20e0;
          fStack_20cc = local_20e0;
          fStack_20c8 = local_20e0;
          fStack_20c4 = local_20e0;
          local_20ac = local_20e0;
          fStack_209c = local_20a0;
          fStack_2098 = local_20a0;
          fStack_2094 = local_20a0;
          fStack_2090 = local_20a0;
          fStack_208c = local_20a0;
          fStack_2088 = local_20a0;
          fStack_2084 = local_20a0;
          local_206c = local_20a0;
          fStack_205c = local_2060;
          fStack_2058 = local_2060;
          fStack_2054 = local_2060;
          fStack_2050 = local_2060;
          fStack_204c = local_2060;
          fStack_2048 = local_2060;
          fStack_2044 = local_2060;
          local_202c = local_2060;
          fStack_201c = local_2020;
          fStack_2018 = local_2020;
          fStack_2014 = local_2020;
          fStack_2010 = local_2020;
          fStack_200c = local_2020;
          fStack_2008 = local_2020;
          fStack_2004 = local_2020;
          local_1fec = local_2020;
          fStack_1fdc = local_1fe0;
          fStack_1fd8 = local_1fe0;
          fStack_1fd4 = local_1fe0;
          fStack_1fd0 = local_1fe0;
          fStack_1fcc = local_1fe0;
          fStack_1fc8 = local_1fe0;
          fStack_1fc4 = local_1fe0;
          local_1fac = local_1fe0;
          fStack_1f9c = local_1fa0;
          fStack_1f98 = local_1fa0;
          fStack_1f94 = local_1fa0;
          fStack_1f90 = local_1fa0;
          fStack_1f8c = local_1fa0;
          fStack_1f88 = local_1fa0;
          fStack_1f84 = local_1fa0;
          local_1f6c = local_1fa0;
          local_1940 = local_19a0;
          uStack_1938 = uStack_1998;
          uStack_1930 = uStack_1990;
          uStack_1928 = uStack_1988;
          local_18e0 = local_19a0;
          uStack_18d8 = uStack_1998;
          uStack_18d0 = uStack_1990;
          uStack_18c8 = uStack_1988;
          local_1880 = local_19a0;
          uStack_1878 = uStack_1998;
          uStack_1870 = uStack_1990;
          uStack_1868 = uStack_1988;
          local_1820 = local_19a0;
          uStack_1818 = uStack_1998;
          uStack_1810 = uStack_1990;
          uStack_1808 = uStack_1988;
          local_17c0 = local_19a0;
          uStack_17b8 = uStack_1998;
          uStack_17b0 = uStack_1990;
          uStack_17a8 = uStack_1988;
          local_1760 = local_19a0;
          uStack_1758 = uStack_1998;
          uStack_1750 = uStack_1990;
          uStack_1748 = uStack_1988;
          local_1700 = local_19a0;
          uStack_16f8 = uStack_1998;
          uStack_16f0 = uStack_1990;
          uStack_16e8 = uStack_1988;
          local_f40 = uVar4;
          uStack_f38 = uVar5;
          uStack_f30 = uVar6;
          uStack_f28 = uVar7;
          fStack_f04 = local_1fa0;
          local_f00 = uVar8;
          uStack_ef8 = uVar9;
          uStack_ef0 = uVar10;
          uStack_ee8 = uVar11;
          fStack_ec4 = local_1fe0;
          local_ec0 = uVar12;
          uStack_eb8 = uVar13;
          uStack_eb0 = uVar14;
          uStack_ea8 = uVar15;
          fStack_e84 = local_2020;
          local_e80 = uVar16;
          uStack_e78 = uVar17;
          uStack_e70 = uVar18;
          uStack_e68 = uVar19;
          fStack_e44 = local_2060;
          local_e40 = uVar20;
          uStack_e38 = uVar21;
          uStack_e30 = uVar22;
          uStack_e28 = uVar23;
          fStack_e04 = local_20a0;
          local_e00 = uVar24;
          uStack_df8 = uVar25;
          uStack_df0 = uVar26;
          uStack_de8 = uVar27;
          fStack_dc4 = local_20e0;
          local_dc0 = uVar28;
          uStack_db8 = uVar29;
          uStack_db0 = uVar30;
          uStack_da8 = uVar31;
          fStack_d84 = local_2120;
          local_d80 = uVar32;
          uStack_d78 = uVar33;
          uStack_d70 = uVar34;
          uStack_d68 = uVar35;
          fStack_d44 = local_2160;
          local_880 = local_19a0;
          uStack_878 = uStack_1998;
          uStack_870 = uStack_1990;
          uStack_868 = uStack_1988;
          local_860 = local_1fa0;
          fStack_85c = local_1fa0;
          fStack_858 = local_1fa0;
          fStack_854 = local_1fa0;
          fStack_850 = local_1fa0;
          fStack_84c = local_1fa0;
          fStack_848 = local_1fa0;
          fStack_844 = local_1fa0;
          local_840 = local_19a0;
          uStack_838 = uStack_1998;
          uStack_830 = uStack_1990;
          uStack_828 = uStack_1988;
          local_820 = local_1fe0;
          fStack_81c = local_1fe0;
          fStack_818 = local_1fe0;
          fStack_814 = local_1fe0;
          fStack_810 = local_1fe0;
          fStack_80c = local_1fe0;
          fStack_808 = local_1fe0;
          fStack_804 = local_1fe0;
          local_800 = local_19a0;
          uStack_7f8 = uStack_1998;
          uStack_7f0 = uStack_1990;
          uStack_7e8 = uStack_1988;
          local_7e0 = local_2020;
          fStack_7dc = local_2020;
          fStack_7d8 = local_2020;
          fStack_7d4 = local_2020;
          fStack_7d0 = local_2020;
          fStack_7cc = local_2020;
          fStack_7c8 = local_2020;
          fStack_7c4 = local_2020;
          local_7c0 = local_19a0;
          uStack_7b8 = uStack_1998;
          uStack_7b0 = uStack_1990;
          uStack_7a8 = uStack_1988;
          local_7a0 = local_2060;
          fStack_79c = local_2060;
          fStack_798 = local_2060;
          fStack_794 = local_2060;
          fStack_790 = local_2060;
          fStack_78c = local_2060;
          fStack_788 = local_2060;
          fStack_784 = local_2060;
          local_780 = local_19a0;
          uStack_778 = uStack_1998;
          uStack_770 = uStack_1990;
          uStack_768 = uStack_1988;
          local_760 = local_20a0;
          fStack_75c = local_20a0;
          fStack_758 = local_20a0;
          fStack_754 = local_20a0;
          fStack_750 = local_20a0;
          fStack_74c = local_20a0;
          fStack_748 = local_20a0;
          fStack_744 = local_20a0;
          local_740 = local_19a0;
          uStack_738 = uStack_1998;
          uStack_730 = uStack_1990;
          uStack_728 = uStack_1988;
          local_720 = local_20e0;
          fStack_71c = local_20e0;
          fStack_718 = local_20e0;
          fStack_714 = local_20e0;
          fStack_710 = local_20e0;
          fStack_70c = local_20e0;
          fStack_708 = local_20e0;
          fStack_704 = local_20e0;
          local_700 = local_19a0;
          uStack_6f8 = uStack_1998;
          uStack_6f0 = uStack_1990;
          uStack_6e8 = uStack_1988;
          local_6e0 = local_2120;
          fStack_6dc = local_2120;
          fStack_6d8 = local_2120;
          fStack_6d4 = local_2120;
          fStack_6d0 = local_2120;
          fStack_6cc = local_2120;
          fStack_6c8 = local_2120;
          fStack_6c4 = local_2120;
          local_6c0 = local_19a0;
          uStack_6b8 = uStack_1998;
          uStack_6b0 = uStack_1990;
          uStack_6a8 = uStack_1988;
          local_6a0 = local_2160;
          fStack_69c = local_2160;
          fStack_698 = local_2160;
          fStack_694 = local_2160;
          fStack_690 = local_2160;
          fStack_68c = local_2160;
          fStack_688 = local_2160;
          fStack_684 = local_2160;
        }
        local_2ce8 = local_4758;
        local_2d20 = local_4be0;
        uStack_2d18 = uStack_4bd8;
        uStack_2d10 = uStack_4bd0;
        uStack_2d08 = uStack_4bc8;
        *(undefined8 *)*local_4758 = local_4be0;
        *(undefined8 *)(*local_4758 + 8) = uStack_4bd8;
        *(undefined8 *)(*local_4758 + 0x10) = uStack_4bd0;
        *(undefined8 *)(*local_4758 + 0x18) = uStack_4bc8;
        local_2d28 = local_4758 + 1;
        local_2d60 = local_4c00;
        uStack_2d58 = uStack_4bf8;
        uStack_2d50 = uStack_4bf0;
        uStack_2d48 = uStack_4be8;
        *(undefined8 *)*local_2d28 = local_4c00;
        *(undefined8 *)(local_4758[1] + 8) = uStack_4bf8;
        *(undefined8 *)(local_4758[1] + 0x10) = uStack_4bf0;
        *(undefined8 *)(local_4758[1] + 0x18) = uStack_4be8;
        local_2d68 = local_4758 + 2;
        local_2da0 = local_4c20;
        uStack_2d98 = uStack_4c18;
        uStack_2d90 = uStack_4c10;
        uStack_2d88 = uStack_4c08;
        *(undefined8 *)*local_2d68 = local_4c20;
        *(undefined8 *)(local_4758[2] + 8) = uStack_4c18;
        *(undefined8 *)(local_4758[2] + 0x10) = uStack_4c10;
        *(undefined8 *)(local_4758[2] + 0x18) = uStack_4c08;
        local_2da8 = local_4758 + 3;
        local_2de0 = local_4c40;
        uStack_2dd8 = uStack_4c38;
        uStack_2dd0 = uStack_4c30;
        uStack_2dc8 = uStack_4c28;
        *(undefined8 *)*local_2da8 = local_4c40;
        *(undefined8 *)(local_4758[3] + 8) = uStack_4c38;
        *(undefined8 *)(local_4758[3] + 0x10) = uStack_4c30;
        *(undefined8 *)(local_4758[3] + 0x18) = uStack_4c28;
        local_2de8 = local_4758 + 4;
        local_2e20 = local_4c60;
        uStack_2e18 = uStack_4c58;
        uStack_2e10 = uStack_4c50;
        uStack_2e08 = uStack_4c48;
        *(undefined8 *)*local_2de8 = local_4c60;
        *(undefined8 *)(local_4758[4] + 8) = uStack_4c58;
        *(undefined8 *)(local_4758[4] + 0x10) = uStack_4c50;
        *(undefined8 *)(local_4758[4] + 0x18) = uStack_4c48;
        local_2e28 = local_4758 + 5;
        local_2e60 = local_4c80;
        uStack_2e58 = uStack_4c78;
        uStack_2e50 = uStack_4c70;
        uStack_2e48 = uStack_4c68;
        *(undefined8 *)*local_2e28 = local_4c80;
        *(undefined8 *)(local_4758[5] + 8) = uStack_4c78;
        *(undefined8 *)(local_4758[5] + 0x10) = uStack_4c70;
        *(undefined8 *)(local_4758[5] + 0x18) = uStack_4c68;
        local_2e68 = local_4758 + 6;
        local_2ea0 = local_4ca0;
        uStack_2e98 = uStack_4c98;
        uStack_2e90 = uStack_4c90;
        uStack_2e88 = uStack_4c88;
        *(undefined8 *)*local_2e68 = local_4ca0;
        *(undefined8 *)(local_4758[6] + 8) = uStack_4c98;
        *(undefined8 *)(local_4758[6] + 0x10) = uStack_4c90;
        *(undefined8 *)(local_4758[6] + 0x18) = uStack_4c88;
        local_2ea8 = local_4758 + 7;
        local_2ee0 = local_4cc0;
        uStack_2ed8 = uStack_4cb8;
        uStack_2ed0 = uStack_4cb0;
        uStack_2ec8 = uStack_4ca8;
        auVar55._8_8_ = uStack_4cb8;
        auVar55._0_8_ = local_4cc0;
        auVar55._16_8_ = uStack_4cb0;
        auVar55._24_8_ = uStack_4ca8;
        *local_2ea8 = auVar55;
        local_4758 = local_4758 + 8;
        local_3e0 = ZEXT832(0) << 0x20;
        local_3c0 = ZEXT832(0) << 0x20;
        local_3a0 = ZEXT832(0) << 0x20;
        local_380 = ZEXT832(0) << 0x20;
        local_360 = ZEXT832(0) << 0x20;
        local_340 = ZEXT832(0) << 0x20;
        local_320 = ZEXT832(0) << 0x20;
      }
      for (; local_483c + 3 < local_3c14; local_483c = local_483c + 4) {
        uVar2 = (long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                      (long)local_483c % 0xc & 0xffffffffU) % 8;
        local_399c = local_483c / 0xc +
                     (int)((long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_483c % 0xc & 0xffffffffU) / 8) +
                     (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                          4);
        local_3998 = &local_4838;
        local_4e08 = (float *)((long)local_90 + (long)local_3c3c * (long)local_399c * local_3c58);
        local_39ac = local_47ec;
        local_39a8 = &local_47e8;
        local_4e10 = (undefined8 *)(local_138 + (long)local_124 * (long)local_47ec * local_140);
        local_400 = 0;
        uStack_3f8 = 0;
        uStack_3f0 = 0;
        uStack_3e8 = 0;
        local_4e40 = 0;
        uStack_4e38 = 0;
        uStack_4e30 = 0;
        uStack_4e28 = 0;
        local_420._8_8_ = SUB328(ZEXT832(0),4);
        local_4e60 = 0;
        uStack_4e58 = local_420._8_8_;
        uStack_4e50 = 0;
        uStack_4e48 = 0;
        local_440._8_8_ = SUB328(ZEXT832(0),4);
        local_4e80 = 0;
        uStack_4e78 = local_440._8_8_;
        uStack_4e70 = 0;
        uStack_4e68 = 0;
        local_460._8_8_ = SUB328(ZEXT832(0),4);
        local_4ea0 = 0;
        uStack_4e98 = local_460._8_8_;
        uStack_4e90 = 0;
        uStack_4e88 = 0;
        for (local_4ea4 = 0; local_4ea4 < local_3c1c << 3; local_4ea4 = local_4ea4 + 1) {
          local_3810 = local_4e10;
          local_1b20 = *local_4e10;
          uStack_1b18 = local_4e10[1];
          uStack_1b10 = local_4e10[2];
          uStack_1b08 = local_4e10[3];
          local_2168 = local_4e08;
          local_21a0 = *local_4e08;
          local_19e0 = CONCAT44(local_21a0,local_21a0);
          uStack_19d8 = CONCAT44(local_21a0,local_21a0);
          uStack_19d0 = CONCAT44(local_21a0,local_21a0);
          uStack_19c8 = CONCAT44(local_21a0,local_21a0);
          local_21a8 = local_4e08 + 1;
          local_21e0 = *local_21a8;
          local_1a40 = CONCAT44(local_21e0,local_21e0);
          uStack_1a38 = CONCAT44(local_21e0,local_21e0);
          uStack_1a30 = CONCAT44(local_21e0,local_21e0);
          uStack_1a28 = CONCAT44(local_21e0,local_21e0);
          local_1a20 = local_4e40;
          uStack_1a18 = uStack_4e38;
          uStack_1a10 = uStack_4e30;
          uStack_1a08 = uStack_4e28;
          local_680._0_4_ = (float)local_1b20;
          local_680._4_4_ = (float)((ulong)local_1b20 >> 0x20);
          uStack_678._0_4_ = (float)uStack_1b18;
          uStack_678._4_4_ = (float)((ulong)uStack_1b18 >> 0x20);
          uStack_670._0_4_ = (float)uStack_1b10;
          uStack_670._4_4_ = (float)((ulong)uStack_1b10 >> 0x20);
          uStack_668._0_4_ = (float)uStack_1b08;
          local_d20 = local_21a0 * (float)local_680;
          fStack_d1c = local_21a0 * local_680._4_4_;
          fStack_d18 = local_21a0 * (float)uStack_678;
          fStack_d14 = local_21a0 * uStack_678._4_4_;
          fStack_d10 = local_21a0 * (float)uStack_670;
          fStack_d0c = local_21a0 * uStack_670._4_4_;
          fStack_d08 = local_21a0 * (float)uStack_668;
          uVar4 = local_4e40;
          uVar5 = uStack_4e38;
          uVar6 = uStack_4e30;
          uVar7 = uStack_4e28;
          local_d40._0_4_ = (float)local_4e40;
          local_d40._4_4_ = (float)((ulong)local_4e40 >> 0x20);
          uStack_d38._0_4_ = (float)uStack_4e38;
          uStack_d38._4_4_ = (float)((ulong)uStack_4e38 >> 0x20);
          uStack_d30._0_4_ = (float)uStack_4e30;
          uStack_d30._4_4_ = (float)((ulong)uStack_4e30 >> 0x20);
          uStack_d28._0_4_ = (float)uStack_4e28;
          uStack_d28._4_4_ = (float)((ulong)uStack_4e28 >> 0x20);
          local_4e40 = CONCAT44(fStack_d1c + local_d40._4_4_,local_d20 + (float)local_d40);
          uStack_4e38 = CONCAT44(fStack_d14 + uStack_d38._4_4_,fStack_d18 + (float)uStack_d38);
          uStack_4e30 = CONCAT44(fStack_d0c + uStack_d30._4_4_,fStack_d10 + (float)uStack_d30);
          uStack_4e28 = CONCAT44(local_21a0 + uStack_d28._4_4_,fStack_d08 + (float)uStack_d28);
          local_1a80 = local_4e60;
          uStack_1a78 = uStack_4e58;
          uStack_1a70 = uStack_4e50;
          uStack_1a68 = uStack_4e48;
          local_ce0 = local_21e0 * (float)local_680;
          fStack_cdc = local_21e0 * local_680._4_4_;
          fStack_cd8 = local_21e0 * (float)uStack_678;
          fStack_cd4 = local_21e0 * uStack_678._4_4_;
          fStack_cd0 = local_21e0 * (float)uStack_670;
          fStack_ccc = local_21e0 * uStack_670._4_4_;
          fStack_cc8 = local_21e0 * (float)uStack_668;
          uVar8 = local_4e60;
          uVar9 = uStack_4e58;
          uVar10 = uStack_4e50;
          uVar11 = uStack_4e48;
          local_d00._0_4_ = (float)local_4e60;
          local_d00._4_4_ = (float)((ulong)local_4e60 >> 0x20);
          uStack_cf8._0_4_ = (float)uStack_4e58;
          uStack_cf8._4_4_ = (float)((ulong)uStack_4e58 >> 0x20);
          uStack_cf0._0_4_ = (float)uStack_4e50;
          uStack_cf0._4_4_ = (float)((ulong)uStack_4e50 >> 0x20);
          uStack_ce8._0_4_ = (float)uStack_4e48;
          uStack_ce8._4_4_ = (float)((ulong)uStack_4e48 >> 0x20);
          local_4e60 = CONCAT44(fStack_cdc + local_d00._4_4_,local_ce0 + (float)local_d00);
          uStack_4e58 = CONCAT44(fStack_cd4 + uStack_cf8._4_4_,fStack_cd8 + (float)uStack_cf8);
          uStack_4e50 = CONCAT44(fStack_ccc + uStack_cf0._4_4_,fStack_cd0 + (float)uStack_cf0);
          uStack_4e48 = CONCAT44(local_21e0 + uStack_ce8._4_4_,fStack_cc8 + (float)uStack_ce8);
          local_21e8 = local_4e08 + 2;
          local_2220 = *local_21e8;
          local_1aa0 = CONCAT44(local_2220,local_2220);
          uStack_1a98 = CONCAT44(local_2220,local_2220);
          uStack_1a90 = CONCAT44(local_2220,local_2220);
          uStack_1a88 = CONCAT44(local_2220,local_2220);
          local_2228 = local_4e08 + 3;
          local_2260 = *local_2228;
          local_1b00 = CONCAT44(local_2260,local_2260);
          uStack_1af8 = CONCAT44(local_2260,local_2260);
          uStack_1af0 = CONCAT44(local_2260,local_2260);
          uStack_1ae8 = CONCAT44(local_2260,local_2260);
          local_1ae0 = local_4e80;
          uStack_1ad8 = uStack_4e78;
          uStack_1ad0 = uStack_4e70;
          uStack_1ac8 = uStack_4e68;
          local_ca0 = local_2220 * (float)local_680;
          fStack_c9c = local_2220 * local_680._4_4_;
          fStack_c98 = local_2220 * (float)uStack_678;
          fStack_c94 = local_2220 * uStack_678._4_4_;
          fStack_c90 = local_2220 * (float)uStack_670;
          fStack_c8c = local_2220 * uStack_670._4_4_;
          fStack_c88 = local_2220 * (float)uStack_668;
          uVar12 = local_4e80;
          uVar13 = uStack_4e78;
          uVar14 = uStack_4e70;
          uVar15 = uStack_4e68;
          local_cc0._0_4_ = (float)local_4e80;
          local_cc0._4_4_ = (float)((ulong)local_4e80 >> 0x20);
          uStack_cb8._0_4_ = (float)uStack_4e78;
          uStack_cb8._4_4_ = (float)((ulong)uStack_4e78 >> 0x20);
          uStack_cb0._0_4_ = (float)uStack_4e70;
          uStack_cb0._4_4_ = (float)((ulong)uStack_4e70 >> 0x20);
          uStack_ca8._0_4_ = (float)uStack_4e68;
          uStack_ca8._4_4_ = (float)((ulong)uStack_4e68 >> 0x20);
          local_4e80 = CONCAT44(fStack_c9c + local_cc0._4_4_,local_ca0 + (float)local_cc0);
          uStack_4e78 = CONCAT44(fStack_c94 + uStack_cb8._4_4_,fStack_c98 + (float)uStack_cb8);
          uStack_4e70 = CONCAT44(fStack_c8c + uStack_cb0._4_4_,fStack_c90 + (float)uStack_cb0);
          uStack_4e68 = CONCAT44(local_2220 + uStack_ca8._4_4_,fStack_c88 + (float)uStack_ca8);
          local_1b40 = local_4ea0;
          uStack_1b38 = uStack_4e98;
          uStack_1b30 = uStack_4e90;
          uStack_1b28 = uStack_4e88;
          local_c60 = local_2260 * (float)local_680;
          fStack_c5c = local_2260 * local_680._4_4_;
          fStack_c58 = local_2260 * (float)uStack_678;
          fStack_c54 = local_2260 * uStack_678._4_4_;
          fStack_c50 = local_2260 * (float)uStack_670;
          fStack_c4c = local_2260 * uStack_670._4_4_;
          fStack_c48 = local_2260 * (float)uStack_668;
          uVar16 = local_4ea0;
          uVar17 = uStack_4e98;
          uVar18 = uStack_4e90;
          uVar19 = uStack_4e88;
          local_c80._0_4_ = (float)local_4ea0;
          local_c80._4_4_ = (float)((ulong)local_4ea0 >> 0x20);
          uStack_c78._0_4_ = (float)uStack_4e98;
          uStack_c78._4_4_ = (float)((ulong)uStack_4e98 >> 0x20);
          uStack_c70._0_4_ = (float)uStack_4e90;
          uStack_c70._4_4_ = (float)((ulong)uStack_4e90 >> 0x20);
          uStack_c68._0_4_ = (float)uStack_4e88;
          uStack_c68._4_4_ = (float)((ulong)uStack_4e88 >> 0x20);
          local_4ea0 = CONCAT44(fStack_c5c + local_c80._4_4_,local_c60 + (float)local_c80);
          uStack_4e98 = CONCAT44(fStack_c54 + uStack_c78._4_4_,fStack_c58 + (float)uStack_c78);
          uStack_4e90 = CONCAT44(fStack_c4c + uStack_c70._4_4_,fStack_c50 + (float)uStack_c70);
          uStack_4e88 = CONCAT44(local_2260 + uStack_c68._4_4_,fStack_c48 + (float)uStack_c68);
          local_4e08 = local_4e08 + 4;
          local_4e10 = local_4e10 + 4;
          fStack_225c = local_2260;
          fStack_2258 = local_2260;
          fStack_2254 = local_2260;
          fStack_2250 = local_2260;
          fStack_224c = local_2260;
          fStack_2248 = local_2260;
          fStack_2244 = local_2260;
          local_222c = local_2260;
          fStack_221c = local_2220;
          fStack_2218 = local_2220;
          fStack_2214 = local_2220;
          fStack_2210 = local_2220;
          fStack_220c = local_2220;
          fStack_2208 = local_2220;
          fStack_2204 = local_2220;
          local_21ec = local_2220;
          fStack_21dc = local_21e0;
          fStack_21d8 = local_21e0;
          fStack_21d4 = local_21e0;
          fStack_21d0 = local_21e0;
          fStack_21cc = local_21e0;
          fStack_21c8 = local_21e0;
          fStack_21c4 = local_21e0;
          local_21ac = local_21e0;
          fStack_219c = local_21a0;
          fStack_2198 = local_21a0;
          fStack_2194 = local_21a0;
          fStack_2190 = local_21a0;
          fStack_218c = local_21a0;
          fStack_2188 = local_21a0;
          fStack_2184 = local_21a0;
          local_216c = local_21a0;
          local_1ac0 = local_1b20;
          uStack_1ab8 = uStack_1b18;
          uStack_1ab0 = uStack_1b10;
          uStack_1aa8 = uStack_1b08;
          local_1a60 = local_1b20;
          uStack_1a58 = uStack_1b18;
          uStack_1a50 = uStack_1b10;
          uStack_1a48 = uStack_1b08;
          local_1a00 = local_1b20;
          uStack_19f8 = uStack_1b18;
          uStack_19f0 = uStack_1b10;
          uStack_19e8 = uStack_1b08;
          local_d40 = uVar4;
          uStack_d38 = uVar5;
          uStack_d30 = uVar6;
          uStack_d28 = uVar7;
          fStack_d04 = local_21a0;
          local_d00 = uVar8;
          uStack_cf8 = uVar9;
          uStack_cf0 = uVar10;
          uStack_ce8 = uVar11;
          fStack_cc4 = local_21e0;
          local_cc0 = uVar12;
          uStack_cb8 = uVar13;
          uStack_cb0 = uVar14;
          uStack_ca8 = uVar15;
          fStack_c84 = local_2220;
          local_c80 = uVar16;
          uStack_c78 = uVar17;
          uStack_c70 = uVar18;
          uStack_c68 = uVar19;
          fStack_c44 = local_2260;
          local_680 = local_1b20;
          uStack_678 = uStack_1b18;
          uStack_670 = uStack_1b10;
          uStack_668 = uStack_1b08;
          local_660 = local_21a0;
          fStack_65c = local_21a0;
          fStack_658 = local_21a0;
          fStack_654 = local_21a0;
          fStack_650 = local_21a0;
          fStack_64c = local_21a0;
          fStack_648 = local_21a0;
          fStack_644 = local_21a0;
          local_640 = local_1b20;
          uStack_638 = uStack_1b18;
          uStack_630 = uStack_1b10;
          uStack_628 = uStack_1b08;
          local_620 = local_21e0;
          fStack_61c = local_21e0;
          fStack_618 = local_21e0;
          fStack_614 = local_21e0;
          fStack_610 = local_21e0;
          fStack_60c = local_21e0;
          fStack_608 = local_21e0;
          fStack_604 = local_21e0;
          local_600 = local_1b20;
          uStack_5f8 = uStack_1b18;
          uStack_5f0 = uStack_1b10;
          uStack_5e8 = uStack_1b08;
          local_5e0 = local_2220;
          fStack_5dc = local_2220;
          fStack_5d8 = local_2220;
          fStack_5d4 = local_2220;
          fStack_5d0 = local_2220;
          fStack_5cc = local_2220;
          fStack_5c8 = local_2220;
          fStack_5c4 = local_2220;
          local_5c0 = local_1b20;
          uStack_5b8 = uStack_1b18;
          uStack_5b0 = uStack_1b10;
          uStack_5a8 = uStack_1b08;
          local_5a0 = local_2260;
          fStack_59c = local_2260;
          fStack_598 = local_2260;
          fStack_594 = local_2260;
          fStack_590 = local_2260;
          fStack_58c = local_2260;
          fStack_588 = local_2260;
          fStack_584 = local_2260;
        }
        local_2ee8 = local_4758;
        local_2f20 = local_4e40;
        uStack_2f18 = uStack_4e38;
        uStack_2f10 = uStack_4e30;
        uStack_2f08 = uStack_4e28;
        *(undefined8 *)*local_4758 = local_4e40;
        *(undefined8 *)(*local_4758 + 8) = uStack_4e38;
        *(undefined8 *)(*local_4758 + 0x10) = uStack_4e30;
        *(undefined8 *)(*local_4758 + 0x18) = uStack_4e28;
        local_2f28 = local_4758 + 1;
        local_2f60 = local_4e60;
        uStack_2f58 = uStack_4e58;
        uStack_2f50 = uStack_4e50;
        uStack_2f48 = uStack_4e48;
        *(undefined8 *)*local_2f28 = local_4e60;
        *(undefined8 *)(local_4758[1] + 8) = uStack_4e58;
        *(undefined8 *)(local_4758[1] + 0x10) = uStack_4e50;
        *(undefined8 *)(local_4758[1] + 0x18) = uStack_4e48;
        local_2f68 = local_4758 + 2;
        local_2fa0 = local_4e80;
        uStack_2f98 = uStack_4e78;
        uStack_2f90 = uStack_4e70;
        uStack_2f88 = uStack_4e68;
        *(undefined8 *)*local_2f68 = local_4e80;
        *(undefined8 *)(local_4758[2] + 8) = uStack_4e78;
        *(undefined8 *)(local_4758[2] + 0x10) = uStack_4e70;
        *(undefined8 *)(local_4758[2] + 0x18) = uStack_4e68;
        local_2fa8 = local_4758 + 3;
        local_2fe0 = local_4ea0;
        uStack_2fd8 = uStack_4e98;
        uStack_2fd0 = uStack_4e90;
        uStack_2fc8 = uStack_4e88;
        auVar54._8_8_ = uStack_4e98;
        auVar54._0_8_ = local_4ea0;
        auVar54._16_8_ = uStack_4e90;
        auVar54._24_8_ = uStack_4e88;
        *local_2fa8 = auVar54;
        local_4758 = local_4758 + 4;
        local_460 = ZEXT832(0) << 0x20;
        local_440 = ZEXT832(0) << 0x20;
        local_420 = ZEXT832(0) << 0x20;
      }
      for (; local_483c + 1 < local_3c14; local_483c = local_483c + 2) {
        uVar2 = (long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                      (long)local_483c % 0xc & 0xffffffffU) % 8;
        uVar3 = (long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                      (long)local_483c % 0xc & 0xffffffffU) % 4;
        local_39bc = local_483c / 0xc +
                     (int)((long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_483c % 0xc & 0xffffffffU) / 8) +
                     (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                          4) + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                           uVar3 & 0xffffffff) / 2);
        local_39b8 = &local_4838;
        local_4f68 = (float *)((long)local_90 + (long)local_3c3c * (long)local_39bc * local_3c58);
        local_39cc = local_47ec;
        local_39c8 = &local_47e8;
        local_4f70 = (undefined8 *)(local_138 + (long)local_124 * (long)local_47ec * local_140);
        local_480 = 0;
        uStack_478 = 0;
        uStack_470 = 0;
        uStack_468 = 0;
        local_4fa0 = 0;
        uStack_4f98 = 0;
        uStack_4f90 = 0;
        uStack_4f88 = 0;
        local_4a0._8_8_ = SUB328(ZEXT832(0),4);
        local_4fc0 = 0;
        uStack_4fb8 = local_4a0._8_8_;
        uStack_4fb0 = 0;
        uStack_4fa8 = 0;
        for (local_4fc4 = 0; local_4fc4 < local_3c1c << 3; local_4fc4 = local_4fc4 + 1) {
          local_3818 = local_4f70;
          local_1be0 = *local_4f70;
          uStack_1bd8 = local_4f70[1];
          uStack_1bd0 = local_4f70[2];
          uStack_1bc8 = local_4f70[3];
          local_2268 = local_4f68;
          local_22a0 = *local_4f68;
          local_1b60 = CONCAT44(local_22a0,local_22a0);
          uStack_1b58 = CONCAT44(local_22a0,local_22a0);
          uStack_1b50 = CONCAT44(local_22a0,local_22a0);
          uStack_1b48 = CONCAT44(local_22a0,local_22a0);
          local_22a8 = local_4f68 + 1;
          local_22e0 = *local_22a8;
          local_1bc0 = CONCAT44(local_22e0,local_22e0);
          uStack_1bb8 = CONCAT44(local_22e0,local_22e0);
          uStack_1bb0 = CONCAT44(local_22e0,local_22e0);
          uStack_1ba8 = CONCAT44(local_22e0,local_22e0);
          local_1ba0 = local_4fa0;
          uStack_1b98 = uStack_4f98;
          uStack_1b90 = uStack_4f90;
          uStack_1b88 = uStack_4f88;
          local_580._0_4_ = (float)local_1be0;
          local_580._4_4_ = (float)((ulong)local_1be0 >> 0x20);
          uStack_578._0_4_ = (float)uStack_1bd8;
          uStack_578._4_4_ = (float)((ulong)uStack_1bd8 >> 0x20);
          uStack_570._0_4_ = (float)uStack_1bd0;
          uStack_570._4_4_ = (float)((ulong)uStack_1bd0 >> 0x20);
          uStack_568._0_4_ = (float)uStack_1bc8;
          local_c20 = local_22a0 * (float)local_580;
          fStack_c1c = local_22a0 * local_580._4_4_;
          fStack_c18 = local_22a0 * (float)uStack_578;
          fStack_c14 = local_22a0 * uStack_578._4_4_;
          fStack_c10 = local_22a0 * (float)uStack_570;
          fStack_c0c = local_22a0 * uStack_570._4_4_;
          fStack_c08 = local_22a0 * (float)uStack_568;
          uVar4 = local_4fa0;
          uVar5 = uStack_4f98;
          uVar6 = uStack_4f90;
          uVar7 = uStack_4f88;
          local_c40._0_4_ = (float)local_4fa0;
          local_c40._4_4_ = (float)((ulong)local_4fa0 >> 0x20);
          uStack_c38._0_4_ = (float)uStack_4f98;
          uStack_c38._4_4_ = (float)((ulong)uStack_4f98 >> 0x20);
          uStack_c30._0_4_ = (float)uStack_4f90;
          uStack_c30._4_4_ = (float)((ulong)uStack_4f90 >> 0x20);
          uStack_c28._0_4_ = (float)uStack_4f88;
          uStack_c28._4_4_ = (float)((ulong)uStack_4f88 >> 0x20);
          local_4fa0 = CONCAT44(fStack_c1c + local_c40._4_4_,local_c20 + (float)local_c40);
          uStack_4f98 = CONCAT44(fStack_c14 + uStack_c38._4_4_,fStack_c18 + (float)uStack_c38);
          uStack_4f90 = CONCAT44(fStack_c0c + uStack_c30._4_4_,fStack_c10 + (float)uStack_c30);
          uStack_4f88 = CONCAT44(local_22a0 + uStack_c28._4_4_,fStack_c08 + (float)uStack_c28);
          local_1c00 = local_4fc0;
          uStack_1bf8 = uStack_4fb8;
          uStack_1bf0 = uStack_4fb0;
          uStack_1be8 = uStack_4fa8;
          local_be0 = local_22e0 * (float)local_580;
          fStack_bdc = local_22e0 * local_580._4_4_;
          fStack_bd8 = local_22e0 * (float)uStack_578;
          fStack_bd4 = local_22e0 * uStack_578._4_4_;
          fStack_bd0 = local_22e0 * (float)uStack_570;
          fStack_bcc = local_22e0 * uStack_570._4_4_;
          fStack_bc8 = local_22e0 * (float)uStack_568;
          uVar8 = local_4fc0;
          uVar9 = uStack_4fb8;
          uVar10 = uStack_4fb0;
          uVar11 = uStack_4fa8;
          local_c00._0_4_ = (float)local_4fc0;
          local_c00._4_4_ = (float)((ulong)local_4fc0 >> 0x20);
          uStack_bf8._0_4_ = (float)uStack_4fb8;
          uStack_bf8._4_4_ = (float)((ulong)uStack_4fb8 >> 0x20);
          uStack_bf0._0_4_ = (float)uStack_4fb0;
          uStack_bf0._4_4_ = (float)((ulong)uStack_4fb0 >> 0x20);
          uStack_be8._0_4_ = (float)uStack_4fa8;
          uStack_be8._4_4_ = (float)((ulong)uStack_4fa8 >> 0x20);
          local_4fc0 = CONCAT44(fStack_bdc + local_c00._4_4_,local_be0 + (float)local_c00);
          uStack_4fb8 = CONCAT44(fStack_bd4 + uStack_bf8._4_4_,fStack_bd8 + (float)uStack_bf8);
          uStack_4fb0 = CONCAT44(fStack_bcc + uStack_bf0._4_4_,fStack_bd0 + (float)uStack_bf0);
          uStack_4fa8 = CONCAT44(local_22e0 + uStack_be8._4_4_,fStack_bc8 + (float)uStack_be8);
          local_4f68 = local_4f68 + 2;
          local_4f70 = local_4f70 + 4;
          fStack_22dc = local_22e0;
          fStack_22d8 = local_22e0;
          fStack_22d4 = local_22e0;
          fStack_22d0 = local_22e0;
          fStack_22cc = local_22e0;
          fStack_22c8 = local_22e0;
          fStack_22c4 = local_22e0;
          local_22ac = local_22e0;
          fStack_229c = local_22a0;
          fStack_2298 = local_22a0;
          fStack_2294 = local_22a0;
          fStack_2290 = local_22a0;
          fStack_228c = local_22a0;
          fStack_2288 = local_22a0;
          fStack_2284 = local_22a0;
          local_226c = local_22a0;
          local_1b80 = local_1be0;
          uStack_1b78 = uStack_1bd8;
          uStack_1b70 = uStack_1bd0;
          uStack_1b68 = uStack_1bc8;
          local_c40 = uVar4;
          uStack_c38 = uVar5;
          uStack_c30 = uVar6;
          uStack_c28 = uVar7;
          fStack_c04 = local_22a0;
          local_c00 = uVar8;
          uStack_bf8 = uVar9;
          uStack_bf0 = uVar10;
          uStack_be8 = uVar11;
          fStack_bc4 = local_22e0;
          local_580 = local_1be0;
          uStack_578 = uStack_1bd8;
          uStack_570 = uStack_1bd0;
          uStack_568 = uStack_1bc8;
          local_560 = local_22a0;
          fStack_55c = local_22a0;
          fStack_558 = local_22a0;
          fStack_554 = local_22a0;
          fStack_550 = local_22a0;
          fStack_54c = local_22a0;
          fStack_548 = local_22a0;
          fStack_544 = local_22a0;
          local_540 = local_1be0;
          uStack_538 = uStack_1bd8;
          uStack_530 = uStack_1bd0;
          uStack_528 = uStack_1bc8;
          local_520 = local_22e0;
          fStack_51c = local_22e0;
          fStack_518 = local_22e0;
          fStack_514 = local_22e0;
          fStack_510 = local_22e0;
          fStack_50c = local_22e0;
          fStack_508 = local_22e0;
          fStack_504 = local_22e0;
        }
        local_2fe8 = local_4758;
        local_3020 = local_4fa0;
        uStack_3018 = uStack_4f98;
        uStack_3010 = uStack_4f90;
        uStack_3008 = uStack_4f88;
        *(undefined8 *)*local_4758 = local_4fa0;
        *(undefined8 *)(*local_4758 + 8) = uStack_4f98;
        *(undefined8 *)(*local_4758 + 0x10) = uStack_4f90;
        *(undefined8 *)(*local_4758 + 0x18) = uStack_4f88;
        local_3028 = local_4758 + 1;
        local_3060 = local_4fc0;
        uStack_3058 = uStack_4fb8;
        uStack_3050 = uStack_4fb0;
        uStack_3048 = uStack_4fa8;
        auVar53._8_8_ = uStack_4fb8;
        auVar53._0_8_ = local_4fc0;
        auVar53._16_8_ = uStack_4fb0;
        auVar53._24_8_ = uStack_4fa8;
        *local_3028 = auVar53;
        local_4758 = local_4758 + 2;
        local_4a0 = ZEXT832(0) << 0x20;
      }
      for (; local_483c < local_3c14; local_483c = local_483c + 1) {
        uVar2 = (long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                      (long)local_483c % 0xc & 0xffffffffU) % 8;
        uVar3 = (long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                      (long)local_483c % 0xc & 0xffffffffU) % 4;
        local_39dc = local_483c / 0xc +
                     (int)((long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_483c % 0xc & 0xffffffffU) / 8) +
                     (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                          4) + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                           uVar3 & 0xffffffff) / 2) +
                     (int)((long)((ulong)(uint)((int)((long)local_483c % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_483c % 0xc & 0xffffffffU) % 2);
        local_39d8 = &local_4838;
        local_5048 = (float *)((long)local_90 + (long)local_3c3c * (long)local_39dc * local_3c58);
        local_39ec = local_47ec;
        local_39e8 = &local_47e8;
        local_5050 = (undefined8 *)(local_138 + (long)local_124 * (long)local_47ec * local_140);
        local_4c0 = 0;
        uStack_4b8 = 0;
        uStack_4b0 = 0;
        uStack_4a8 = 0;
        local_5080 = 0;
        uStack_5078 = 0;
        uStack_5070 = 0;
        uStack_5068 = 0;
        for (local_5084 = 0; local_5084 < local_3c1c << 3; local_5084 = local_5084 + 1) {
          local_3820 = local_5050;
          local_1c40 = *local_5050;
          uStack_1c38 = local_5050[1];
          uStack_1c30 = local_5050[2];
          uStack_1c28 = local_5050[3];
          local_22e8 = local_5048;
          local_2320 = *local_5048;
          local_1c20 = CONCAT44(local_2320,local_2320);
          uStack_1c18 = CONCAT44(local_2320,local_2320);
          uStack_1c10 = CONCAT44(local_2320,local_2320);
          uStack_1c08 = CONCAT44(local_2320,local_2320);
          local_1c60 = local_5080;
          uStack_1c58 = uStack_5078;
          uStack_1c50 = uStack_5070;
          uStack_1c48 = uStack_5068;
          local_500._0_4_ = (float)local_1c40;
          local_500._4_4_ = (float)((ulong)local_1c40 >> 0x20);
          uStack_4f8._0_4_ = (float)uStack_1c38;
          uStack_4f8._4_4_ = (float)((ulong)uStack_1c38 >> 0x20);
          uStack_4f0._0_4_ = (float)uStack_1c30;
          uStack_4f0._4_4_ = (float)((ulong)uStack_1c30 >> 0x20);
          uStack_4e8._0_4_ = (float)uStack_1c28;
          local_ba0 = local_2320 * (float)local_500;
          fStack_b9c = local_2320 * local_500._4_4_;
          fStack_b98 = local_2320 * (float)uStack_4f8;
          fStack_b94 = local_2320 * uStack_4f8._4_4_;
          fStack_b90 = local_2320 * (float)uStack_4f0;
          fStack_b8c = local_2320 * uStack_4f0._4_4_;
          fStack_b88 = local_2320 * (float)uStack_4e8;
          uVar4 = local_5080;
          uVar5 = uStack_5078;
          uVar6 = uStack_5070;
          uVar7 = uStack_5068;
          local_bc0._0_4_ = (float)local_5080;
          local_bc0._4_4_ = (float)((ulong)local_5080 >> 0x20);
          uStack_bb8._0_4_ = (float)uStack_5078;
          uStack_bb8._4_4_ = (float)((ulong)uStack_5078 >> 0x20);
          uStack_bb0._0_4_ = (float)uStack_5070;
          uStack_bb0._4_4_ = (float)((ulong)uStack_5070 >> 0x20);
          uStack_ba8._0_4_ = (float)uStack_5068;
          uStack_ba8._4_4_ = (float)((ulong)uStack_5068 >> 0x20);
          local_5080 = CONCAT44(fStack_b9c + local_bc0._4_4_,local_ba0 + (float)local_bc0);
          uStack_5078 = CONCAT44(fStack_b94 + uStack_bb8._4_4_,fStack_b98 + (float)uStack_bb8);
          uStack_5070 = CONCAT44(fStack_b8c + uStack_bb0._4_4_,fStack_b90 + (float)uStack_bb0);
          uStack_5068 = CONCAT44(local_2320 + uStack_ba8._4_4_,fStack_b88 + (float)uStack_ba8);
          local_5048 = local_5048 + 1;
          local_5050 = local_5050 + 4;
          fStack_231c = local_2320;
          fStack_2318 = local_2320;
          fStack_2314 = local_2320;
          fStack_2310 = local_2320;
          fStack_230c = local_2320;
          fStack_2308 = local_2320;
          fStack_2304 = local_2320;
          local_22ec = local_2320;
          local_bc0 = uVar4;
          uStack_bb8 = uVar5;
          uStack_bb0 = uVar6;
          uStack_ba8 = uVar7;
          fStack_b84 = local_2320;
          local_500 = local_1c40;
          uStack_4f8 = uStack_1c38;
          uStack_4f0 = uStack_1c30;
          uStack_4e8 = uStack_1c28;
          local_4e0 = local_2320;
          fStack_4dc = local_2320;
          fStack_4d8 = local_2320;
          fStack_4d4 = local_2320;
          fStack_4d0 = local_2320;
          fStack_4cc = local_2320;
          fStack_4c8 = local_2320;
          fStack_4c4 = local_2320;
        }
        local_3068 = local_4758;
        local_30a0 = local_5080;
        uStack_3098 = uStack_5078;
        uStack_3090 = uStack_5070;
        uStack_3088 = uStack_5068;
        auVar52._8_8_ = uStack_5078;
        auVar52._0_8_ = local_5080;
        auVar52._16_8_ = uStack_5070;
        auVar52._24_8_ = uStack_5068;
        *local_4758 = auVar52;
        local_4758 = local_4758 + 1;
      }
      local_3ba8 = &local_4838;
      local_4818 = local_3c48;
      local_6c = 0x10;
      local_7c = local_3c3c;
      local_80 = local_3c38;
      local_84 = local_3c34;
      local_98 = local_3c58;
      local_9c = local_3c50;
      local_a8 = local_3c48;
      local_3a84 = local_47ec;
      local_3a85 = 1;
      local_4838 = 0;
      local_4828 = 0;
      local_4820 = 0;
      local_4810 = 0;
      local_480c = 0;
      local_4808 = 0;
      local_4804 = 0;
      local_4800 = 0;
      local_47f8 = 0;
      local_4830 = 0;
      local_3af0 = local_3ba8;
    }
    local_3b98 = &local_47e8;
    local_4768 = 0;
    local_476c = 0;
    local_4770 = 0;
    local_4774 = 0;
    local_4788 = 0;
    local_4790 = 0;
    local_4798 = 0;
    local_47a0 = 0;
    local_394c = local_474c;
    local_394d = 1;
    local_3a54 = local_474c;
    local_3a55 = 1;
    local_4760 = 0;
    local_4778 = 0;
    local_47e8 = 0;
    local_47d8 = 0;
    local_47d0 = 0;
    local_47c0 = 0;
    local_47bc = 0;
    local_47b8 = 0;
    local_47b4 = 0;
    local_47b0 = 0;
    local_47a8 = 0;
    local_47e0 = 0;
    local_3b10 = local_3b98;
    local_3ad0 = local_3bb8;
    local_47c8 = local_150;
    local_4780 = local_e0;
  }
  ppvVar63 = &local_3c68;
  if (local_3c60 != (int *)0x0) {
    local_3b34 = 0xffffffff;
    LOCK();
    local_3b38 = *local_3c60;
    *local_3c60 = *local_3c60 + -1;
    UNLOCK();
    if (local_3b38 == 1) {
      local_3b88 = ppvVar63;
      local_3b30 = ppvVar63;
      if (local_3c48 == (long *)0x0) {
        local_3888 = local_3c68;
        if (local_3c68 != (void *)0x0) {
          free(local_3c68);
        }
      }
      else {
        (**(code **)(*local_3c48 + 0x18))(local_3c48,local_3c68);
      }
    }
  }
  *ppvVar63 = (void *)0x0;
  ppvVar63[2] = (void *)0x0;
  *(undefined4 *)(ppvVar63 + 3) = 0;
  *(undefined4 *)(ppvVar63 + 5) = 0;
  *(undefined4 *)((long)ppvVar63 + 0x2c) = 0;
  *(undefined4 *)(ppvVar63 + 6) = 0;
  *(undefined4 *)((long)ppvVar63 + 0x34) = 0;
  *(undefined4 *)(ppvVar63 + 7) = 0;
  ppvVar63[8] = (void *)0x0;
  ppvVar63[1] = (void *)0x0;
  return;
}

Assistant:

static void convolution_winograd_dot_pack8_avx(Mat& bottom_blob_tm, int outch, const Mat& kernel_tm, Mat& top_blob_tm, const Option& opt)
{
    // Mat bottom_blob_tm(tiles, 16/36/64, inch, 32u, 4, opt.workspace_allocator);

    const int tiles = bottom_blob_tm.w;
    const int batch = bottom_blob_tm.h;
    const int inch = bottom_blob_tm.c;

    // permute
    Mat bottom_blob_tm2;
    if (tiles >= 12)
        bottom_blob_tm2.create(12 * inch, tiles / 12 + (tiles % 12) / 8 + (tiles % 12 % 8) / 4 + (tiles % 12 % 4) / 2 + tiles % 12 % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 8)
        bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + (tiles % 4) / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 4)
        bottom_blob_tm2.create(4 * inch, tiles / 4 + (tiles % 4) / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 2)
        bottom_blob_tm2.create(2 * inch, tiles / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else // if (tiles >= 1)
        bottom_blob_tm2.create(1 * inch, tiles, batch, 32u, 8, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int r = 0; r < batch; r++)
    {
        Mat tm2 = bottom_blob_tm2.channel(r);

        // tile
        int i = 0;

        for (; i + 11 < tiles; i += 12)
        {
            float* tmpptr = tm2.row(i / 12);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x12
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(r0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(r0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(r0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(r0 + 8 * 11);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                __m256 _tmp8 = _mm256_unpacklo_ps(_r8, _r9);
                __m256 _tmp9 = _mm256_unpackhi_ps(_r8, _r9);
                __m256 _tmpa = _mm256_unpacklo_ps(_ra, _rb);
                __m256 _tmpb = _mm256_unpackhi_ps(_ra, _rb);
                __m256 _tmpc = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpd = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpe = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpf = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpg = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmph = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpi = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpj = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpk = _mm256_shuffle_ps(_tmp8, _tmpa, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpl = _mm256_shuffle_ps(_tmp8, _tmpa, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpm = _mm256_shuffle_ps(_tmp9, _tmpb, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpn = _mm256_shuffle_ps(_tmp9, _tmpb, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmpc, _tmpg, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmpk, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmph, _tmpl, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2f128_ps(_tmpe, _tmpi, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2f128_ps(_tmpm, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                _r5 = _mm256_permute2f128_ps(_tmpj, _tmpn, _MM_SHUFFLE(0, 2, 0, 0));
                _r6 = _mm256_permute2f128_ps(_tmpc, _tmpg, _MM_SHUFFLE(0, 3, 0, 1));
                _r7 = _mm256_permute2f128_ps(_tmpk, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                _r8 = _mm256_permute2f128_ps(_tmph, _tmpl, _MM_SHUFFLE(0, 3, 0, 1));
                _r9 = _mm256_permute2f128_ps(_tmpe, _tmpi, _MM_SHUFFLE(0, 3, 0, 1));
                _ra = _mm256_permute2f128_ps(_tmpm, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));
                _rb = _mm256_permute2f128_ps(_tmpj, _tmpn, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);
                _mm256_store_ps(tmpptr + 8 * 4, _r4);
                _mm256_store_ps(tmpptr + 8 * 5, _r5);
                _mm256_store_ps(tmpptr + 8 * 6, _r6);
                _mm256_store_ps(tmpptr + 8 * 7, _r7);
                _mm256_store_ps(tmpptr + 8 * 8, _r8);
                _mm256_store_ps(tmpptr + 8 * 9, _r9);
                _mm256_store_ps(tmpptr + 8 * 10, _ra);
                _mm256_store_ps(tmpptr + 8 * 11, _rb);

                tmpptr += 96;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 7 < tiles; i += 8)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x8
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);
                _mm256_store_ps(tmpptr + 8 * 4, _r4);
                _mm256_store_ps(tmpptr + 8 * 5, _r5);
                _mm256_store_ps(tmpptr + 8 * 6, _r6);
                _mm256_store_ps(tmpptr + 8 * 7, _r7);

                tmpptr += 64;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 3 < tiles; i += 4)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x4
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp5 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmp6 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp7 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 3, 0, 1));
                _r3 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);

                tmpptr += 32;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 1 < tiles; i += 2)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x2
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                _r0 = _mm256_permute2f128_ps(_tmp0, _tmp1, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp0, _tmp1, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);

                tmpptr += 16;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }

        for (; i < tiles; i++)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            const float* r0 = bottom_blob_tm;
            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                __m256 _val = _mm256_load_ps(r0);
                _mm256_store_ps(tmpptr, _val);

                tmpptr += 8;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
    }

    bottom_blob_tm = Mat();
    // permute end

    top_blob_tm.create(tiles, batch, outch, 32u, 8, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* output0_tm = top_blob_tm.channel(p);

        const Mat kernel0_tm = kernel_tm.channel(p);

        for (int r = 0; r < batch; r++)
        {
            const Mat bb2 = bottom_blob_tm2.channel(r);

            int i = 0;
            for (; i + 11 < tiles; i += 12)
            {
                const float* r0 = bb2.row(i / 12);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();
                __m256 _sum4 = _mm256_setzero_ps();
                __m256 _sum5 = _mm256_setzero_ps();
                __m256 _sum6 = _mm256_setzero_ps();
                __m256 _sum7 = _mm256_setzero_ps();
                __m256 _sum8 = _mm256_setzero_ps();
                __m256 _sum9 = _mm256_setzero_ps();
                __m256 _suma = _mm256_setzero_ps();
                __m256 _sumb = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                    __m256 _val4 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _val5 = _mm256_broadcast_ss(r0 + 5);
                    _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                    __m256 _val6 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _val7 = _mm256_broadcast_ss(r0 + 7);
                    _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);
                    __m256 _val8 = _mm256_broadcast_ss(r0 + 8);
                    __m256 _val9 = _mm256_broadcast_ss(r0 + 9);
                    _sum8 = _mm256_comp_fmadd_ps(_val8, _w0, _sum8);
                    _sum9 = _mm256_comp_fmadd_ps(_val9, _w0, _sum9);
                    __m256 _vala = _mm256_broadcast_ss(r0 + 10);
                    __m256 _valb = _mm256_broadcast_ss(r0 + 11);
                    _suma = _mm256_comp_fmadd_ps(_vala, _w0, _suma);
                    _sumb = _mm256_comp_fmadd_ps(_valb, _w0, _sumb);

                    r0 += 12;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);
                _mm256_store_ps(output0_tm + 8 * 4, _sum4);
                _mm256_store_ps(output0_tm + 8 * 5, _sum5);
                _mm256_store_ps(output0_tm + 8 * 6, _sum6);
                _mm256_store_ps(output0_tm + 8 * 7, _sum7);
                _mm256_store_ps(output0_tm + 8 * 8, _sum8);
                _mm256_store_ps(output0_tm + 8 * 9, _sum9);
                _mm256_store_ps(output0_tm + 8 * 10, _suma);
                _mm256_store_ps(output0_tm + 8 * 11, _sumb);

                output0_tm += 8 * 12;
            }
            for (; i + 7 < tiles; i += 8)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();
                __m256 _sum4 = _mm256_setzero_ps();
                __m256 _sum5 = _mm256_setzero_ps();
                __m256 _sum6 = _mm256_setzero_ps();
                __m256 _sum7 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                    __m256 _val4 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _val5 = _mm256_broadcast_ss(r0 + 5);
                    _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                    __m256 _val6 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _val7 = _mm256_broadcast_ss(r0 + 7);
                    _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                    r0 += 8;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);
                _mm256_store_ps(output0_tm + 8 * 4, _sum4);
                _mm256_store_ps(output0_tm + 8 * 5, _sum5);
                _mm256_store_ps(output0_tm + 8 * 6, _sum6);
                _mm256_store_ps(output0_tm + 8 * 7, _sum7);

                output0_tm += 8 * 8;
            }
            for (; i + 3 < tiles; i += 4)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                    r0 += 4;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);

                output0_tm += 8 * 4;
            }
            for (; i + 1 < tiles; i += 2)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);

                    r0 += 2;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);

                output0_tm += 8 * 2;
            }

            for (; i < tiles; i++)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);
                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                    r0 += 1;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);

                output0_tm += 8;
            }
        }
    }
}